

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 *puVar1;
  float *pfVar2;
  BBox1f BVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCRayQueryContext *pRVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  size_t k;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined4 uVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  bool bVar90;
  int iVar91;
  uint uVar92;
  AABBNodeMB4D *node1;
  ulong uVar93;
  ulong uVar94;
  long lVar95;
  long lVar96;
  undefined1 (*pauVar97) [32];
  ulong uVar98;
  vuint<4> *v;
  long lVar99;
  ulong uVar100;
  undefined4 uVar101;
  ulong unaff_R12;
  NodeRef root;
  ulong *puVar102;
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  float fVar131;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar143;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  float fVar159;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar177;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [64];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar195 [64];
  uint uVar196;
  float fVar197;
  undefined1 auVar198 [32];
  float fVar200;
  uint uVar201;
  float fVar202;
  uint uVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar199 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  QuadMesh *mesh;
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  Vec3<embree::vfloat_impl<8>_> p0;
  vbool<8> terminated;
  vfloat<8> t;
  vfloat<8> v_2;
  vfloat<8> u;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_6001;
  RTCFilterFunctionNArguments local_6000;
  undefined1 local_5fc0 [32];
  ulong local_5f98;
  ulong local_5f90;
  RayK<8> *local_5f88;
  undefined1 local_5f80 [32];
  undefined1 local_5f60 [32];
  undefined1 local_5f40 [32];
  undefined1 (*local_5f18) [32];
  BVH *local_5f10;
  Intersectors *local_5f08;
  float local_5f00 [4];
  float fStack_5ef0;
  float fStack_5eec;
  float fStack_5ee8;
  float fStack_5ee4;
  float local_5ee0 [4];
  float fStack_5ed0;
  float fStack_5ecc;
  float fStack_5ec8;
  undefined4 uStack_5ec4;
  float local_5ec0 [4];
  float fStack_5eb0;
  float fStack_5eac;
  float fStack_5ea8;
  undefined4 uStack_5ea4;
  undefined1 local_5ea0 [32];
  undefined1 local_5e80 [32];
  undefined1 local_5e60 [32];
  long local_5e38;
  ulong local_5e30;
  ulong local_5e28;
  undefined1 local_5e20 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5e00;
  undefined8 local_5da0;
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  uint local_5d20;
  uint uStack_5d1c;
  uint uStack_5d18;
  uint uStack_5d14;
  uint uStack_5d10;
  uint uStack_5d0c;
  uint uStack_5d08;
  uint uStack_5d04;
  uint local_5d00;
  uint uStack_5cfc;
  uint uStack_5cf8;
  uint uStack_5cf4;
  uint uStack_5cf0;
  uint uStack_5cec;
  uint uStack_5ce8;
  uint uStack_5ce4;
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [8];
  float fStack_5c98;
  float fStack_5c94;
  float fStack_5c90;
  float fStack_5c8c;
  float fStack_5c88;
  float fStack_5c84;
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [32];
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [8];
  float fStack_5b58;
  float fStack_5b54;
  float fStack_5b50;
  float fStack_5b4c;
  float fStack_5b48;
  float fStack_5b44;
  undefined1 local_5b40 [8];
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  float fStack_5b24;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined1 local_5ae0 [32];
  undefined4 local_5ac0;
  undefined4 uStack_5abc;
  uint uStack_5ab8;
  uint uStack_5ab4;
  uint uStack_5ab0;
  uint uStack_5aac;
  uint uStack_5aa8;
  uint uStack_5aa4;
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar194 [32];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    auVar126 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar121 = ZEXT816(0) << 0x40;
    auVar132 = vpcmpeqd_avx2(auVar126,(undefined1  [32])valid_i->field_0);
    auVar126 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar121),5);
    auVar122 = auVar132 & auVar126;
    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar122 >> 0x7f,0) != '\0') ||
          (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar122 >> 0xbf,0) != '\0') ||
        (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar122[0x1f] < '\0') {
      auVar126 = vandps_avx(auVar126,auVar132);
      auVar104 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
      local_5a40._0_4_ = *(float *)ray;
      local_5a40._4_4_ = *(float *)(ray + 4);
      local_5a40._8_4_ = *(float *)(ray + 8);
      local_5a40._12_4_ = *(float *)(ray + 0xc);
      local_5a40._16_4_ = *(float *)(ray + 0x10);
      local_5a40._20_4_ = *(float *)(ray + 0x14);
      local_5a40._24_4_ = *(float *)(ray + 0x18);
      local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5a40._32_4_ = *(float *)(ray + 0x20);
      local_5a40._36_4_ = *(float *)(ray + 0x24);
      local_5a40._40_4_ = *(float *)(ray + 0x28);
      local_5a40._44_4_ = *(float *)(ray + 0x2c);
      local_5a40._48_4_ = *(float *)(ray + 0x30);
      local_5a40._52_4_ = *(float *)(ray + 0x34);
      local_5a40._56_4_ = *(float *)(ray + 0x38);
      local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5a40._64_4_ = *(float *)(ray + 0x40);
      local_5a40._68_4_ = *(float *)(ray + 0x44);
      local_5a40._72_4_ = *(float *)(ray + 0x48);
      local_5a40._76_4_ = *(float *)(ray + 0x4c);
      local_5a40._80_4_ = *(float *)(ray + 0x50);
      local_5a40._84_4_ = *(float *)(ray + 0x54);
      local_5a40._88_4_ = *(float *)(ray + 0x58);
      local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
      local_5b80._8_4_ = 0x7fffffff;
      local_5b80._0_8_ = 0x7fffffff7fffffff;
      local_5b80._12_4_ = 0x7fffffff;
      local_5b80._16_4_ = 0x7fffffff;
      local_5b80._20_4_ = 0x7fffffff;
      local_5b80._24_4_ = 0x7fffffff;
      local_5b80._28_4_ = 0x7fffffff;
      auVar199 = ZEXT3264(local_5b80);
      auVar193._8_4_ = 0x219392ef;
      auVar193._0_8_ = 0x219392ef219392ef;
      auVar193._12_4_ = 0x219392ef;
      auVar193._16_4_ = 0x219392ef;
      auVar193._20_4_ = 0x219392ef;
      auVar193._24_4_ = 0x219392ef;
      auVar193._28_4_ = 0x219392ef;
      auVar126 = vandps_avx(local_5b80,local_59e0);
      auVar126 = vcmpps_avx(auVar126,auVar193,1);
      auVar122 = vblendvps_avx(local_59e0,auVar193,auVar126);
      auVar126 = vandps_avx(local_5b80,local_59c0);
      auVar126 = vcmpps_avx(auVar126,auVar193,1);
      auVar132 = vblendvps_avx(local_59c0,auVar193,auVar126);
      auVar126 = vandps_avx(local_59a0,local_5b80);
      auVar126 = vcmpps_avx(auVar126,auVar193,1);
      auVar126 = vblendvps_avx(local_59a0,auVar193,auVar126);
      auVar113 = vrcpps_avx(auVar122);
      auVar194._8_4_ = 0x3f800000;
      auVar194._0_8_ = 0x3f8000003f800000;
      auVar194._12_4_ = 0x3f800000;
      auVar194._16_4_ = 0x3f800000;
      auVar194._20_4_ = 0x3f800000;
      auVar194._24_4_ = 0x3f800000;
      auVar194._28_4_ = 0x3f800000;
      auVar195 = ZEXT3264(auVar194);
      auVar17 = vfnmadd213ps_fma(auVar122,auVar113,auVar194);
      auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar113,auVar113);
      auVar122 = vrcpps_avx(auVar132);
      auVar18 = vfnmadd213ps_fma(auVar132,auVar122,auVar194);
      auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar122,auVar122);
      auVar182 = ZEXT1664(auVar18);
      auVar122 = vrcpps_avx(auVar126);
      auVar19 = vfnmadd213ps_fma(auVar126,auVar122,auVar194);
      auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar122,auVar122);
      local_5980 = ZEXT1632(auVar17);
      local_5960 = ZEXT1632(auVar18);
      local_5940 = ZEXT1632(auVar19);
      local_5920 = auVar17._0_4_ * *(float *)ray;
      fStack_591c = auVar17._4_4_ * *(float *)(ray + 4);
      fStack_5918 = auVar17._8_4_ * *(float *)(ray + 8);
      fStack_5914 = auVar17._12_4_ * *(float *)(ray + 0xc);
      fStack_5910 = *(float *)(ray + 0x10) * 0.0;
      fStack_590c = *(float *)(ray + 0x14) * 0.0;
      fStack_5908 = *(float *)(ray + 0x18) * 0.0;
      uStack_5904 = *(undefined4 *)(ray + 0x1c);
      local_5900 = *(float *)(ray + 0x20) * auVar18._0_4_;
      fStack_58fc = *(float *)(ray + 0x24) * auVar18._4_4_;
      fStack_58f8 = *(float *)(ray + 0x28) * auVar18._8_4_;
      fStack_58f4 = *(float *)(ray + 0x2c) * auVar18._12_4_;
      fStack_58f0 = *(float *)(ray + 0x30) * 0.0;
      fStack_58ec = *(float *)(ray + 0x34) * 0.0;
      fStack_58e8 = *(float *)(ray + 0x38) * 0.0;
      uStack_58e4 = *(undefined4 *)(ray + 0x3c);
      local_58e0 = *(float *)(ray + 0x40) * auVar19._0_4_;
      fStack_58dc = *(float *)(ray + 0x44) * auVar19._4_4_;
      fStack_58d8 = *(float *)(ray + 0x48) * auVar19._8_4_;
      fStack_58d4 = *(float *)(ray + 0x4c) * auVar19._12_4_;
      fStack_58d0 = *(float *)(ray + 0x50) * 0.0;
      fStack_58cc = *(float *)(ray + 0x54) * 0.0;
      fStack_58c8 = *(float *)(ray + 0x58) * 0.0;
      uStack_58c4 = *(undefined4 *)(ray + 0x5c);
      auVar126 = vcmpps_avx(ZEXT1632(auVar17),ZEXT1632(auVar121),1);
      auVar122._8_4_ = 0x20;
      auVar122._0_8_ = 0x2000000020;
      auVar122._12_4_ = 0x20;
      auVar122._16_4_ = 0x20;
      auVar122._20_4_ = 0x20;
      auVar122._24_4_ = 0x20;
      auVar122._28_4_ = 0x20;
      local_58c0 = vandps_avx(auVar126,auVar122);
      auVar132._8_4_ = 0x40;
      auVar132._0_8_ = 0x4000000040;
      auVar132._12_4_ = 0x40;
      auVar132._16_4_ = 0x40;
      auVar132._20_4_ = 0x40;
      auVar132._24_4_ = 0x40;
      auVar132._28_4_ = 0x40;
      auVar144._8_4_ = 0x60;
      auVar144._0_8_ = 0x6000000060;
      auVar144._12_4_ = 0x60;
      auVar144._16_4_ = 0x60;
      auVar144._20_4_ = 0x60;
      auVar144._24_4_ = 0x60;
      auVar144._28_4_ = 0x60;
      auVar122 = ZEXT1632(auVar121);
      auVar126 = vcmpps_avx(ZEXT1632(auVar18),auVar122,5);
      local_58a0 = vblendvps_avx(auVar144,auVar132,auVar126);
      auVar113._8_4_ = 0x80;
      auVar113._0_8_ = 0x8000000080;
      auVar113._12_4_ = 0x80;
      auVar113._16_4_ = 0x80;
      auVar113._20_4_ = 0x80;
      auVar113._24_4_ = 0x80;
      auVar113._28_4_ = 0x80;
      auVar145._8_4_ = 0xa0;
      auVar145._0_8_ = 0xa0000000a0;
      auVar145._12_4_ = 0xa0;
      auVar145._16_4_ = 0xa0;
      auVar145._20_4_ = 0xa0;
      auVar145._24_4_ = 0xa0;
      auVar145._28_4_ = 0xa0;
      auVar126 = vcmpps_avx(ZEXT1632(auVar19),auVar122,5);
      local_5880 = vblendvps_avx(auVar145,auVar113,auVar126);
      auVar126 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar122);
      auVar122 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar122);
      local_5ae0 = vpmovsxwd_avx2(auVar104);
      auVar151 = ZEXT3264(local_5ae0);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar213 = ZEXT3264(local_4680);
      local_5860 = vblendvps_avx(local_4680,auVar126,local_5ae0);
      auVar126._8_4_ = 0xff800000;
      auVar126._0_8_ = 0xff800000ff800000;
      auVar126._12_4_ = 0xff800000;
      auVar126._16_4_ = 0xff800000;
      auVar126._20_4_ = 0xff800000;
      auVar126._24_4_ = 0xff800000;
      auVar126._28_4_ = 0xff800000;
      local_5840 = vblendvps_avx(auVar126,auVar122,local_5ae0);
      auVar121 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
      auVar130 = ZEXT1664(auVar121);
      local_5cc0 = vpmovsxwd_avx2(auVar104 ^ auVar121);
      local_5f08 = This;
      local_5f10 = (BVH *)This->ptr;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar100 = 7;
      }
      else {
        uVar100 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      local_5f88 = ray + 0x100;
      puVar102 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar97 = (undefined1 (*) [32])local_4640;
      local_4660 = local_5860;
      local_5b00 = mm_lookupmask_ps._16_8_;
      uStack_5af8 = mm_lookupmask_ps._24_8_;
      uStack_5af0 = mm_lookupmask_ps._16_8_;
      uStack_5ae8 = mm_lookupmask_ps._24_8_;
      local_5f18 = (undefined1 (*) [32])&local_5d20;
      local_5b20 = mm_lookupmask_pd._0_8_;
      uStack_5b18 = mm_lookupmask_pd._8_8_;
      uStack_5b10 = mm_lookupmask_pd._0_8_;
      uStack_5b08 = mm_lookupmask_pd._8_8_;
LAB_016a93cb:
      do {
        do {
          root.ptr = puVar102[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_016aaab4;
          puVar102 = puVar102 + -1;
          pauVar97 = pauVar97 + -1;
          local_5fc0 = *pauVar97;
          auVar214 = ZEXT3264(local_5fc0);
          auVar126 = vcmpps_avx(local_5fc0,local_5840,1);
        } while ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar126 >> 0x7f,0) == '\0') &&
                   (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar126 >> 0xbf,0) == '\0') &&
                 (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar126[0x1f]);
        uVar101 = vmovmskps_avx(auVar126);
        unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar101);
        if (uVar100 < CONCAT44(0,POPCOUNT(uVar101))) {
LAB_016a9408:
          do {
            lVar96 = -0x20;
            uVar196 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_016aaab4;
              auVar126 = vcmpps_avx(local_5840,auVar214._0_32_,6);
              if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar126 >> 0x7f,0) == '\0') &&
                    (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar126 >> 0xbf,0) == '\0') &&
                  (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar126[0x1f]) goto LAB_016a93cb;
              lVar96 = (ulong)(uVar196 & 0xf) - 8;
              local_5ac0 = local_5cc0._0_4_;
              uStack_5abc = local_5cc0._4_4_;
              uStack_5ab8 = local_5cc0._8_4_;
              uStack_5ab4 = local_5cc0._12_4_;
              uStack_5ab0 = local_5cc0._16_4_;
              uStack_5aac = local_5cc0._20_4_;
              uStack_5aa8 = local_5cc0._24_4_;
              uStack_5aa4 = local_5cc0._28_4_;
              local_5ce0._0_8_ = local_5cc0._0_8_ ^ 0xffffffffffffffff;
              local_5ce0._8_4_ = local_5cc0._8_4_ ^ 0xffffffff;
              local_5ce0._12_4_ = local_5cc0._12_4_ ^ 0xffffffff;
              local_5ce0._16_4_ = local_5cc0._16_4_ ^ 0xffffffff;
              local_5ce0._20_4_ = local_5cc0._20_4_ ^ 0xffffffff;
              local_5ce0._24_4_ = local_5cc0._24_4_ ^ 0xffffffff;
              local_5ce0._28_4_ = local_5cc0._28_4_ ^ 0xffffffff;
              lVar95 = 0;
              goto LAB_016a96bf;
            }
            uVar93 = root.ptr & 0xfffffffffffffff0;
            auVar126 = vcmpps_avx(local_5840,auVar214._0_32_,6);
            root.ptr = 8;
            auVar122 = auVar213._0_32_;
            for (; (auVar214 = ZEXT3264(auVar122), lVar96 != 0 &&
                   (uVar94 = *(ulong *)(uVar93 + 0x40 + lVar96 * 2), uVar94 != 8));
                lVar96 = lVar96 + 4) {
              uVar101 = *(undefined4 *)(uVar93 + 0x120 + lVar96);
              auVar133._4_4_ = uVar101;
              auVar133._0_4_ = uVar101;
              auVar133._8_4_ = uVar101;
              auVar133._12_4_ = uVar101;
              auVar133._16_4_ = uVar101;
              auVar133._20_4_ = uVar101;
              auVar133._24_4_ = uVar101;
              auVar133._28_4_ = uVar101;
              uVar101 = *(undefined4 *)(uVar93 + 0x60 + lVar96);
              auVar123._4_4_ = uVar101;
              auVar123._0_4_ = uVar101;
              auVar123._8_4_ = uVar101;
              auVar123._12_4_ = uVar101;
              auVar123._16_4_ = uVar101;
              auVar123._20_4_ = uVar101;
              auVar123._24_4_ = uVar101;
              auVar123._28_4_ = uVar101;
              auVar132 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar101 = *(undefined4 *)(uVar93 + 0x160 + lVar96);
              auVar146._4_4_ = uVar101;
              auVar146._0_4_ = uVar101;
              auVar146._8_4_ = uVar101;
              auVar146._12_4_ = uVar101;
              auVar146._16_4_ = uVar101;
              auVar146._20_4_ = uVar101;
              auVar146._24_4_ = uVar101;
              auVar146._28_4_ = uVar101;
              auVar121 = vfmadd231ps_fma(auVar123,auVar132,auVar133);
              uVar101 = *(undefined4 *)(uVar93 + 0xa0 + lVar96);
              auVar134._4_4_ = uVar101;
              auVar134._0_4_ = uVar101;
              auVar134._8_4_ = uVar101;
              auVar134._12_4_ = uVar101;
              auVar134._16_4_ = uVar101;
              auVar134._20_4_ = uVar101;
              auVar134._24_4_ = uVar101;
              auVar134._28_4_ = uVar101;
              auVar104 = vfmadd231ps_fma(auVar134,auVar132,auVar146);
              uVar101 = *(undefined4 *)(uVar93 + 0x1a0 + lVar96);
              auVar160._4_4_ = uVar101;
              auVar160._0_4_ = uVar101;
              auVar160._8_4_ = uVar101;
              auVar160._12_4_ = uVar101;
              auVar160._16_4_ = uVar101;
              auVar160._20_4_ = uVar101;
              auVar160._24_4_ = uVar101;
              auVar160._28_4_ = uVar101;
              uVar101 = *(undefined4 *)(uVar93 + 0xe0 + lVar96);
              auVar147._4_4_ = uVar101;
              auVar147._0_4_ = uVar101;
              auVar147._8_4_ = uVar101;
              auVar147._12_4_ = uVar101;
              auVar147._16_4_ = uVar101;
              auVar147._20_4_ = uVar101;
              auVar147._24_4_ = uVar101;
              auVar147._28_4_ = uVar101;
              uVar101 = *(undefined4 *)(uVar93 + 0x140 + lVar96);
              auVar178._4_4_ = uVar101;
              auVar178._0_4_ = uVar101;
              auVar178._8_4_ = uVar101;
              auVar178._12_4_ = uVar101;
              auVar178._16_4_ = uVar101;
              auVar178._20_4_ = uVar101;
              auVar178._24_4_ = uVar101;
              auVar178._28_4_ = uVar101;
              uVar101 = *(undefined4 *)(uVar93 + 0x80 + lVar96);
              auVar170._4_4_ = uVar101;
              auVar170._0_4_ = uVar101;
              auVar170._8_4_ = uVar101;
              auVar170._12_4_ = uVar101;
              auVar170._16_4_ = uVar101;
              auVar170._20_4_ = uVar101;
              auVar170._24_4_ = uVar101;
              auVar170._28_4_ = uVar101;
              auVar17 = vfmadd231ps_fma(auVar147,auVar132,auVar160);
              auVar18 = vfmadd231ps_fma(auVar170,auVar132,auVar178);
              uVar101 = *(undefined4 *)(uVar93 + 0x180 + lVar96);
              auVar161._4_4_ = uVar101;
              auVar161._0_4_ = uVar101;
              auVar161._8_4_ = uVar101;
              auVar161._12_4_ = uVar101;
              auVar161._16_4_ = uVar101;
              auVar161._20_4_ = uVar101;
              auVar161._24_4_ = uVar101;
              auVar161._28_4_ = uVar101;
              uVar101 = *(undefined4 *)(uVar93 + 0xc0 + lVar96);
              auVar179._4_4_ = uVar101;
              auVar179._0_4_ = uVar101;
              auVar179._8_4_ = uVar101;
              auVar179._12_4_ = uVar101;
              auVar179._16_4_ = uVar101;
              auVar179._20_4_ = uVar101;
              auVar179._24_4_ = uVar101;
              auVar179._28_4_ = uVar101;
              uVar101 = *(undefined4 *)(uVar93 + 0x1c0 + lVar96);
              auVar189._4_4_ = uVar101;
              auVar189._0_4_ = uVar101;
              auVar189._8_4_ = uVar101;
              auVar189._12_4_ = uVar101;
              auVar189._16_4_ = uVar101;
              auVar189._20_4_ = uVar101;
              auVar189._24_4_ = uVar101;
              auVar189._28_4_ = uVar101;
              auVar19 = vfmadd231ps_fma(auVar179,auVar132,auVar161);
              uVar101 = *(undefined4 *)(uVar93 + 0x100 + lVar96);
              auVar192._4_4_ = uVar101;
              auVar192._0_4_ = uVar101;
              auVar192._8_4_ = uVar101;
              auVar192._12_4_ = uVar101;
              auVar192._16_4_ = uVar101;
              auVar192._20_4_ = uVar101;
              auVar192._24_4_ = uVar101;
              auVar192._28_4_ = uVar101;
              auVar14 = vfmadd231ps_fma(auVar192,auVar132,auVar189);
              auVar195 = ZEXT3264(local_5940);
              auVar53._4_4_ = fStack_591c;
              auVar53._0_4_ = local_5920;
              auVar53._8_4_ = fStack_5918;
              auVar53._12_4_ = fStack_5914;
              auVar53._16_4_ = fStack_5910;
              auVar53._20_4_ = fStack_590c;
              auVar53._24_4_ = fStack_5908;
              auVar53._28_4_ = uStack_5904;
              auVar199 = ZEXT3264(auVar53);
              auVar121 = vfmsub213ps_fma(ZEXT1632(auVar121),local_5980,auVar53);
              auVar54._4_4_ = fStack_58fc;
              auVar54._0_4_ = local_5900;
              auVar54._8_4_ = fStack_58f8;
              auVar54._12_4_ = fStack_58f4;
              auVar54._16_4_ = fStack_58f0;
              auVar54._20_4_ = fStack_58ec;
              auVar54._24_4_ = fStack_58e8;
              auVar54._28_4_ = uStack_58e4;
              in_ZMM12 = ZEXT3264(auVar54);
              auVar104 = vfmsub213ps_fma(ZEXT1632(auVar104),local_5960,auVar54);
              auVar55._4_4_ = fStack_58dc;
              auVar55._0_4_ = local_58e0;
              auVar55._8_4_ = fStack_58d8;
              auVar55._12_4_ = fStack_58d4;
              auVar55._16_4_ = fStack_58d0;
              auVar55._20_4_ = fStack_58cc;
              auVar55._24_4_ = fStack_58c8;
              auVar55._28_4_ = uStack_58c4;
              auVar17 = vfmsub213ps_fma(ZEXT1632(auVar17),local_5940,auVar55);
              auVar151 = ZEXT1664(auVar17);
              auVar18 = vfmsub213ps_fma(ZEXT1632(auVar18),local_5980,auVar53);
              auVar19 = vfmsub213ps_fma(ZEXT1632(auVar19),local_5960,auVar54);
              auVar182 = ZEXT1664(auVar19);
              auVar14 = vfmsub213ps_fma(ZEXT1632(auVar14),local_5940,auVar55);
              auVar113 = vpminsd_avx2(ZEXT1632(auVar121),ZEXT1632(auVar18));
              auVar144 = vpminsd_avx2(ZEXT1632(auVar104),ZEXT1632(auVar19));
              auVar113 = vpmaxsd_avx2(auVar113,auVar144);
              auVar144 = vpminsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar14));
              auVar144 = vpmaxsd_avx2(auVar113,auVar144);
              auVar113 = vpmaxsd_avx2(ZEXT1632(auVar121),ZEXT1632(auVar18));
              auVar145 = vpmaxsd_avx2(ZEXT1632(auVar104),ZEXT1632(auVar19));
              auVar145 = vpminsd_avx2(auVar113,auVar145);
              auVar113 = vpmaxsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar14));
              auVar145 = vpminsd_avx2(auVar145,auVar113);
              auVar113 = vpmaxsd_avx2(auVar144,local_5860);
              auVar145 = vpminsd_avx2(auVar145,local_5840);
              auVar113 = vcmpps_avx(auVar113,auVar145,2);
              if ((uVar196 & 7) == 6) {
                uVar101 = *(undefined4 *)(uVar93 + 0x1e0 + lVar96);
                auVar135._4_4_ = uVar101;
                auVar135._0_4_ = uVar101;
                auVar135._8_4_ = uVar101;
                auVar135._12_4_ = uVar101;
                auVar135._16_4_ = uVar101;
                auVar135._20_4_ = uVar101;
                auVar135._24_4_ = uVar101;
                auVar135._28_4_ = uVar101;
                auVar145 = vcmpps_avx(auVar135,auVar132,2);
                uVar101 = *(undefined4 *)(uVar93 + 0x200 + lVar96);
                auVar148._4_4_ = uVar101;
                auVar148._0_4_ = uVar101;
                auVar148._8_4_ = uVar101;
                auVar148._12_4_ = uVar101;
                auVar148._16_4_ = uVar101;
                auVar148._20_4_ = uVar101;
                auVar148._24_4_ = uVar101;
                auVar148._28_4_ = uVar101;
                auVar151 = ZEXT3264(auVar148);
                auVar132 = vcmpps_avx(auVar132,auVar148,1);
                auVar132 = vandps_avx(auVar145,auVar132);
                auVar132 = vandps_avx(auVar132,auVar113);
                auVar121 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
              }
              else {
                auVar121 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
              }
              auVar104 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
              auVar130 = ZEXT1664(auVar104);
              auVar121 = vpand_avx(auVar121,auVar104);
              auVar132 = vpmovzxwd_avx2(auVar121);
              auVar113 = vpslld_avx2(auVar132,0x1f);
              uVar98 = root.ptr;
              auVar132 = auVar122;
              if (((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar113 >> 0x7f,0) != '\0') ||
                     (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar113 >> 0xbf,0) != '\0') ||
                   (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar113[0x1f] < '\0') &&
                 (auVar132 = vblendvps_avx(auVar213._0_32_,auVar144,auVar113), uVar98 = uVar94,
                 root.ptr != 8)) {
                *puVar102 = root.ptr;
                puVar102 = puVar102 + 1;
                *pauVar97 = auVar122;
                pauVar97 = pauVar97 + 1;
              }
              auVar122 = auVar132;
              root.ptr = uVar98;
            }
            if (root.ptr == 8) goto LAB_016a9656;
            auVar126 = vcmpps_avx(local_5840,auVar122,6);
            uVar101 = vmovmskps_avx(auVar126);
          } while ((byte)uVar100 < (byte)POPCOUNT(uVar101));
          *puVar102 = root.ptr;
          puVar102 = puVar102 + 1;
          *pauVar97 = auVar122;
          pauVar97 = pauVar97 + 1;
LAB_016a9656:
          iVar91 = 4;
        }
        else {
          local_5e80._0_8_ = CONCAT44(0,POPCOUNT(uVar101));
          while (unaff_R12 != 0) {
            k = 0;
            for (uVar93 = unaff_R12; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            unaff_R12 = unaff_R12 - 1 & unaff_R12;
            local_5f40._0_8_ = k;
            auVar130 = ZEXT1664(auVar130._0_16_);
            auVar151 = ZEXT1664(auVar151._0_16_);
            auVar182 = ZEXT1664(auVar182._0_16_);
            auVar195 = ZEXT1664(auVar195._0_16_);
            auVar199 = ZEXT1664(auVar199._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            bVar90 = occluded1(local_5f08,local_5f10,root,k,&local_6001,ray,
                               (TravRayK<8,_false> *)&local_5a40.field_0,context);
            if (bVar90) {
              *(undefined4 *)(local_5cc0 + local_5f40._0_8_ * 4) = 0xffffffff;
            }
          }
          auVar126 = _DAT_01f7b020 & ~local_5cc0;
          iVar91 = 3;
          auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar214 = ZEXT3264(local_5fc0);
          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar126 >> 0x7f,0) != '\0') ||
                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0xbf,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar126[0x1f] < '\0') {
            auVar129._8_4_ = 0xff800000;
            auVar129._0_8_ = 0xff800000ff800000;
            auVar129._12_4_ = 0xff800000;
            auVar129._16_4_ = 0xff800000;
            auVar129._20_4_ = 0xff800000;
            auVar129._24_4_ = 0xff800000;
            auVar129._28_4_ = 0xff800000;
            auVar130 = ZEXT3264(auVar129);
            local_5840 = vblendvps_avx(local_5840,auVar129,local_5cc0);
            iVar91 = 2;
          }
          unaff_R12 = 0;
          if ((uint)uVar100 < (uint)local_5e80._0_4_) goto LAB_016a9408;
        }
      } while (iVar91 != 3);
LAB_016aaab4:
      auVar126 = vandps_avx(local_5ae0,local_5cc0);
      auVar120._8_4_ = 0xff800000;
      auVar120._0_8_ = 0xff800000ff800000;
      auVar120._12_4_ = 0xff800000;
      auVar120._16_4_ = 0xff800000;
      auVar120._20_4_ = 0xff800000;
      auVar120._24_4_ = 0xff800000;
      auVar120._28_4_ = 0xff800000;
      auVar126 = vmaskmovps_avx(auVar126,auVar120);
      *(undefined1 (*) [32])local_5f88 = auVar126;
    }
  }
  return;
LAB_016a96bf:
  do {
    auVar126 = auVar130._0_32_;
    if (lVar95 == lVar96) break;
    local_5e38 = lVar95;
    lVar99 = lVar95 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    uVar92 = vmovmskps_avx(local_5ce0);
    uVar93 = CONCAT44((int)((ulong)lVar95 >> 0x20),uVar92);
    uVar196 = 0;
    for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
      uVar196 = uVar196 + 1;
    }
    local_5e28 = (ulong)uVar196;
    local_5f90 = uVar93;
    local_5f98 = 0;
    for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
      local_5f98 = local_5f98 + 1;
    }
    auVar122 = local_5ce0;
    for (unaff_R12 = 0;
        (unaff_R12 != 4 && (iVar91 = *(int *)(lVar99 + 0x50 + unaff_R12 * 4), iVar91 != -1));
        unaff_R12 = unaff_R12 + 1) {
      local_5c80._0_4_ = iVar91;
      local_5e30 = (ulong)*(uint *)(lVar99 + 0x40 + unaff_R12 * 4);
      pGVar9 = (context->scene->geometries).items[local_5e30].ptr;
      BVar3 = pGVar9->time_range;
      auVar104._8_8_ = 0;
      auVar104._0_4_ = BVar3.lower;
      auVar104._4_4_ = BVar3.upper;
      fVar103 = BVar3.lower;
      auVar114._4_4_ = fVar103;
      auVar114._0_4_ = fVar103;
      auVar114._8_4_ = fVar103;
      auVar114._12_4_ = fVar103;
      auVar114._16_4_ = fVar103;
      auVar114._20_4_ = fVar103;
      auVar114._24_4_ = fVar103;
      auVar114._28_4_ = fVar103;
      auVar126 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar114);
      auVar121 = vmovshdup_avx(auVar104);
      auVar121 = vsubps_avx(auVar121,auVar104);
      auVar105._0_4_ = auVar121._0_4_;
      auVar105._4_4_ = auVar105._0_4_;
      auVar105._8_4_ = auVar105._0_4_;
      auVar105._12_4_ = auVar105._0_4_;
      auVar105._16_4_ = auVar105._0_4_;
      auVar105._20_4_ = auVar105._0_4_;
      auVar105._24_4_ = auVar105._0_4_;
      auVar105._28_4_ = auVar105._0_4_;
      auVar126 = vdivps_avx(auVar126,auVar105);
      fVar103 = pGVar9->fnumTimeSegments;
      auVar13._4_4_ = fVar103 * auVar126._4_4_;
      auVar13._0_4_ = fVar103 * auVar126._0_4_;
      auVar13._8_4_ = fVar103 * auVar126._8_4_;
      auVar13._12_4_ = fVar103 * auVar126._12_4_;
      auVar13._16_4_ = fVar103 * auVar126._16_4_;
      auVar13._20_4_ = fVar103 * auVar126._20_4_;
      auVar13._24_4_ = fVar103 * auVar126._24_4_;
      auVar13._28_4_ = auVar126._28_4_;
      auVar126 = vroundps_avx(auVar13,1);
      fVar103 = fVar103 + -1.0;
      auVar115._4_4_ = fVar103;
      auVar115._0_4_ = fVar103;
      auVar115._8_4_ = fVar103;
      auVar115._12_4_ = fVar103;
      auVar115._16_4_ = fVar103;
      auVar115._20_4_ = fVar103;
      auVar115._24_4_ = fVar103;
      auVar115._28_4_ = fVar103;
      auVar126 = vminps_avx(auVar126,auVar115);
      auVar126 = vmaxps_avx(auVar126,_DAT_01f7b000);
      auVar132 = vsubps_avx(auVar13,auVar126);
      auVar126 = vcvtps2dq_avx(auVar126);
      local_6000.valid = (int *)auVar126._0_8_;
      local_6000.geometryUserPtr = (void *)auVar126._8_8_;
      local_6000.context = (RTCRayQueryContext *)auVar126._16_8_;
      local_6000.ray = (RTCRayN *)auVar126._24_8_;
      iVar91 = *(int *)((long)&local_6000.valid + local_5e28 * 4);
      auVar124._4_4_ = iVar91;
      auVar124._0_4_ = iVar91;
      auVar124._8_4_ = iVar91;
      auVar124._12_4_ = iVar91;
      auVar124._16_4_ = iVar91;
      auVar124._20_4_ = iVar91;
      auVar124._24_4_ = iVar91;
      auVar124._28_4_ = iVar91;
      auVar126 = vpcmpeqd_avx2(auVar124,auVar126);
      auVar126 = local_5ce0 & ~auVar126;
      local_5f40 = auVar122;
      fVar206 = auVar132._4_4_;
      fVar208 = auVar132._8_4_;
      fVar159 = auVar132._12_4_;
      fVar167 = auVar132._16_4_;
      fVar168 = auVar132._20_4_;
      fVar169 = auVar132._24_4_;
      fVar103 = auVar132._0_4_;
      auVar130._28_36_ = auVar199._28_36_;
      auVar199._28_36_ = in_ZMM12._28_36_;
      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0x7f,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0xbf,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar126[0x1f]) {
        lVar95 = *(long *)(*(long *)&pGVar9[2].numPrimitives + (long)iVar91 * 0x38);
        lVar10 = *(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + (long)iVar91 * 0x38);
        uVar93 = (ulong)*(uint *)(lVar99 + unaff_R12 * 4);
        uVar101 = *(undefined4 *)(lVar95 + uVar93 * 4);
        auVar162._4_4_ = uVar101;
        auVar162._0_4_ = uVar101;
        auVar162._8_4_ = uVar101;
        auVar162._12_4_ = uVar101;
        auVar162._16_4_ = uVar101;
        auVar162._20_4_ = uVar101;
        auVar162._24_4_ = uVar101;
        auVar162._28_4_ = uVar101;
        uVar101 = *(undefined4 *)(lVar95 + 4 + uVar93 * 4);
        auVar171._4_4_ = uVar101;
        auVar171._0_4_ = uVar101;
        auVar171._8_4_ = uVar101;
        auVar171._12_4_ = uVar101;
        auVar171._16_4_ = uVar101;
        auVar171._20_4_ = uVar101;
        auVar171._24_4_ = uVar101;
        auVar171._28_4_ = uVar101;
        uVar101 = *(undefined4 *)(lVar95 + 8 + uVar93 * 4);
        auVar180._4_4_ = uVar101;
        auVar180._0_4_ = uVar101;
        auVar180._8_4_ = uVar101;
        auVar180._12_4_ = uVar101;
        auVar180._16_4_ = uVar101;
        auVar180._20_4_ = uVar101;
        auVar180._24_4_ = uVar101;
        auVar180._28_4_ = uVar101;
        fVar177 = *(float *)(lVar10 + uVar93 * 4);
        fVar183 = *(float *)(lVar10 + 4 + uVar93 * 4);
        fVar184 = *(float *)(lVar10 + 8 + uVar93 * 4);
        uVar93 = (ulong)*(uint *)(lVar99 + 0x10 + unaff_R12 * 4);
        auVar125._8_4_ = 0x3f800000;
        auVar125._0_8_ = 0x3f8000003f800000;
        auVar125._12_4_ = 0x3f800000;
        auVar125._16_4_ = 0x3f800000;
        auVar125._20_4_ = 0x3f800000;
        auVar125._24_4_ = 0x3f800000;
        auVar125._28_4_ = 0x3f800000;
        auVar126 = vsubps_avx(auVar125,auVar132);
        auVar20._4_4_ = fVar206 * fVar177;
        auVar20._0_4_ = fVar103 * fVar177;
        auVar20._8_4_ = fVar208 * fVar177;
        auVar20._12_4_ = fVar159 * fVar177;
        auVar20._16_4_ = fVar167 * fVar177;
        auVar20._20_4_ = fVar168 * fVar177;
        auVar20._24_4_ = fVar169 * fVar177;
        auVar20._28_4_ = fVar177;
        auVar21._4_4_ = fVar206 * fVar183;
        auVar21._0_4_ = fVar103 * fVar183;
        auVar21._8_4_ = fVar208 * fVar183;
        auVar21._12_4_ = fVar159 * fVar183;
        auVar21._16_4_ = fVar167 * fVar183;
        auVar21._20_4_ = fVar168 * fVar183;
        auVar21._24_4_ = fVar169 * fVar183;
        auVar21._28_4_ = 0x3f800000;
        auVar22._4_4_ = fVar184 * fVar206;
        auVar22._0_4_ = fVar184 * fVar103;
        auVar22._8_4_ = fVar184 * fVar208;
        auVar22._12_4_ = fVar184 * fVar159;
        auVar22._16_4_ = fVar184 * fVar167;
        auVar22._20_4_ = fVar184 * fVar168;
        auVar22._24_4_ = fVar184 * fVar169;
        auVar22._28_4_ = fVar183;
        auVar121 = vfmadd231ps_fma(auVar20,auVar126,auVar162);
        auVar117 = ZEXT1632(auVar121);
        auVar121 = vfmadd231ps_fma(auVar21,auVar126,auVar171);
        auVar195 = ZEXT1664(auVar121);
        auVar121 = vfmadd231ps_fma(auVar22,auVar126,auVar180);
        auVar151 = ZEXT1664(auVar121);
        uVar101 = *(undefined4 *)(lVar95 + uVar93 * 4);
        auVar163._4_4_ = uVar101;
        auVar163._0_4_ = uVar101;
        auVar163._8_4_ = uVar101;
        auVar163._12_4_ = uVar101;
        auVar163._16_4_ = uVar101;
        auVar163._20_4_ = uVar101;
        auVar163._24_4_ = uVar101;
        auVar163._28_4_ = uVar101;
        uVar101 = *(undefined4 *)(lVar95 + 4 + uVar93 * 4);
        auVar172._4_4_ = uVar101;
        auVar172._0_4_ = uVar101;
        auVar172._8_4_ = uVar101;
        auVar172._12_4_ = uVar101;
        auVar172._16_4_ = uVar101;
        auVar172._20_4_ = uVar101;
        auVar172._24_4_ = uVar101;
        auVar172._28_4_ = uVar101;
        uVar101 = *(undefined4 *)(lVar95 + 8 + uVar93 * 4);
        auVar181._4_4_ = uVar101;
        auVar181._0_4_ = uVar101;
        auVar181._8_4_ = uVar101;
        auVar181._12_4_ = uVar101;
        auVar181._16_4_ = uVar101;
        auVar181._20_4_ = uVar101;
        auVar181._24_4_ = uVar101;
        auVar181._28_4_ = uVar101;
        fVar177 = *(float *)(lVar10 + uVar93 * 4);
        fVar183 = *(float *)(lVar10 + 4 + uVar93 * 4);
        fVar184 = *(float *)(lVar10 + 8 + uVar93 * 4);
        auVar214._0_4_ = fVar177 * fVar103;
        auVar214._4_4_ = fVar177 * fVar206;
        auVar214._8_4_ = fVar177 * fVar208;
        auVar214._12_4_ = fVar177 * fVar159;
        auVar214._16_4_ = fVar177 * fVar167;
        auVar214._20_4_ = fVar177 * fVar168;
        auVar214._24_4_ = fVar177 * fVar169;
        auVar213._0_4_ = fVar183 * fVar103;
        auVar213._4_4_ = fVar183 * fVar206;
        auVar213._8_4_ = fVar183 * fVar208;
        auVar213._12_4_ = fVar183 * fVar159;
        auVar213._16_4_ = fVar183 * fVar167;
        auVar213._20_4_ = fVar183 * fVar168;
        auVar213._24_4_ = fVar183 * fVar169;
        auVar130._0_4_ = fVar184 * fVar103;
        auVar130._4_4_ = fVar184 * fVar206;
        auVar130._8_4_ = fVar184 * fVar208;
        auVar130._12_4_ = fVar184 * fVar159;
        auVar130._16_4_ = fVar184 * fVar167;
        auVar130._20_4_ = fVar184 * fVar168;
        auVar130._24_4_ = fVar184 * fVar169;
        auVar121 = vfmadd231ps_fma(auVar214._0_32_,auVar126,auVar163);
        local_5fc0 = ZEXT1632(auVar121);
        auVar121 = vfmadd231ps_fma(auVar213._0_32_,auVar126,auVar172);
        auVar212 = ZEXT1632(auVar121);
        uVar93 = (ulong)*(uint *)(lVar99 + 0x20 + unaff_R12 * 4);
        uVar101 = *(undefined4 *)(lVar95 + uVar93 * 4);
        auVar164._4_4_ = uVar101;
        auVar164._0_4_ = uVar101;
        auVar164._8_4_ = uVar101;
        auVar164._12_4_ = uVar101;
        auVar164._16_4_ = uVar101;
        auVar164._20_4_ = uVar101;
        auVar164._24_4_ = uVar101;
        auVar164._28_4_ = uVar101;
        uVar101 = *(undefined4 *)(lVar95 + 4 + uVar93 * 4);
        auVar173._4_4_ = uVar101;
        auVar173._0_4_ = uVar101;
        auVar173._8_4_ = uVar101;
        auVar173._12_4_ = uVar101;
        auVar173._16_4_ = uVar101;
        auVar173._20_4_ = uVar101;
        auVar173._24_4_ = uVar101;
        auVar173._28_4_ = uVar101;
        uVar101 = *(undefined4 *)(lVar95 + 8 + uVar93 * 4);
        auVar190._4_4_ = uVar101;
        auVar190._0_4_ = uVar101;
        auVar190._8_4_ = uVar101;
        auVar190._12_4_ = uVar101;
        auVar190._16_4_ = uVar101;
        auVar190._20_4_ = uVar101;
        auVar190._24_4_ = uVar101;
        auVar190._28_4_ = uVar101;
        fVar177 = *(float *)(lVar10 + uVar93 * 4);
        fVar183 = *(float *)(lVar10 + 4 + uVar93 * 4);
        auVar121 = vfmadd231ps_fma(auVar130._0_32_,auVar126,auVar181);
        local_5a60 = ZEXT1632(auVar121);
        fVar184 = *(float *)(lVar10 + 8 + uVar93 * 4);
        auVar199._0_4_ = fVar177 * fVar103;
        auVar199._4_4_ = fVar177 * fVar206;
        auVar199._8_4_ = fVar177 * fVar208;
        auVar199._12_4_ = fVar177 * fVar159;
        auVar199._16_4_ = fVar177 * fVar167;
        auVar199._20_4_ = fVar177 * fVar168;
        auVar199._24_4_ = fVar177 * fVar169;
        auVar23._4_4_ = fVar183 * fVar206;
        auVar23._0_4_ = fVar183 * fVar103;
        auVar23._8_4_ = fVar183 * fVar208;
        auVar23._12_4_ = fVar183 * fVar159;
        auVar23._16_4_ = fVar183 * fVar167;
        auVar23._20_4_ = fVar183 * fVar168;
        auVar23._24_4_ = fVar183 * fVar169;
        auVar23._28_4_ = fVar177;
        auVar24._4_4_ = fVar206 * fVar184;
        auVar24._0_4_ = fVar103 * fVar184;
        auVar24._8_4_ = fVar208 * fVar184;
        auVar24._12_4_ = fVar159 * fVar184;
        auVar24._16_4_ = fVar167 * fVar184;
        auVar24._20_4_ = fVar168 * fVar184;
        auVar24._24_4_ = fVar169 * fVar184;
        auVar24._28_4_ = fVar184;
        auVar121 = vfmadd231ps_fma(auVar199._0_32_,auVar126,auVar164);
        _local_5b60 = ZEXT1632(auVar121);
        auVar121 = vfmadd231ps_fma(auVar23,auVar126,auVar173);
        _local_5ca0 = ZEXT1632(auVar121);
        auVar121 = vfmadd231ps_fma(auVar24,auVar126,auVar190);
        _local_5b40 = ZEXT1632(auVar121);
        uVar93 = (ulong)*(uint *)(lVar99 + 0x30 + unaff_R12 * 4);
        uVar101 = *(undefined4 *)(lVar95 + uVar93 * 4);
        auVar165._4_4_ = uVar101;
        auVar165._0_4_ = uVar101;
        auVar165._8_4_ = uVar101;
        auVar165._12_4_ = uVar101;
        auVar165._16_4_ = uVar101;
        auVar165._20_4_ = uVar101;
        auVar165._24_4_ = uVar101;
        auVar165._28_4_ = uVar101;
        fVar177 = *(float *)(lVar10 + uVar93 * 4);
        fVar184 = *(float *)(lVar10 + 4 + uVar93 * 4);
        fVar185 = *(float *)(lVar10 + 8 + uVar93 * 4);
        auVar25._4_4_ = fVar206 * fVar177;
        auVar25._0_4_ = fVar103 * fVar177;
        auVar25._8_4_ = fVar208 * fVar177;
        auVar25._12_4_ = fVar159 * fVar177;
        auVar25._16_4_ = fVar167 * fVar177;
        auVar25._20_4_ = fVar168 * fVar177;
        auVar25._24_4_ = fVar169 * fVar177;
        auVar25._28_4_ = fVar177;
        auVar26._4_4_ = fVar206 * fVar184;
        auVar26._0_4_ = fVar103 * fVar184;
        auVar26._8_4_ = fVar208 * fVar184;
        auVar26._12_4_ = fVar159 * fVar184;
        auVar26._16_4_ = fVar167 * fVar184;
        auVar26._20_4_ = fVar168 * fVar184;
        auVar26._24_4_ = fVar169 * fVar184;
        auVar26._28_4_ = fVar183;
        auVar27._4_4_ = fVar185 * fVar206;
        auVar27._0_4_ = fVar185 * fVar103;
        auVar27._8_4_ = fVar185 * fVar208;
        auVar27._12_4_ = fVar185 * fVar159;
        auVar27._16_4_ = fVar185 * fVar167;
        auVar27._20_4_ = fVar185 * fVar168;
        auVar27._24_4_ = fVar185 * fVar169;
        auVar27._28_4_ = fVar185;
        auVar121 = vfmadd231ps_fma(auVar25,auVar126,auVar165);
        auVar130 = ZEXT1664(auVar121);
        uVar101 = *(undefined4 *)(lVar95 + 4 + uVar93 * 4);
        auVar106._4_4_ = uVar101;
        auVar106._0_4_ = uVar101;
        auVar106._8_4_ = uVar101;
        auVar106._12_4_ = uVar101;
        auVar106._16_4_ = uVar101;
        auVar106._20_4_ = uVar101;
        auVar106._24_4_ = uVar101;
        auVar106._28_4_ = uVar101;
        auVar121 = vfmadd231ps_fma(auVar26,auVar126,auVar106);
        local_5e20 = ZEXT1632(auVar121);
        uVar101 = *(undefined4 *)(lVar95 + 8 + uVar93 * 4);
        auVar107._4_4_ = uVar101;
        auVar107._0_4_ = uVar101;
        auVar107._8_4_ = uVar101;
        auVar107._12_4_ = uVar101;
        auVar107._16_4_ = uVar101;
        auVar107._20_4_ = uVar101;
        auVar107._24_4_ = uVar101;
        auVar107._28_4_ = uVar101;
        auVar121 = vfmadd231ps_fma(auVar27,auVar126,auVar107);
        auVar213 = ZEXT1664(auVar121);
      }
      else {
        local_5f60._0_8_ = lVar96;
        uVar94 = local_5f90;
        uVar93 = local_5f98;
        while (fVar6 = fStack_5ee4, fVar188 = fStack_5ee8, fVar187 = fStack_5eec,
              fVar186 = fStack_5ef0, fVar185 = local_5f00[3], fVar184 = local_5f00[2],
              fVar183 = local_5f00[1], fVar177 = local_5f00[0], uVar94 != 0) {
          lVar95 = (long)*(int *)((long)&local_6000.valid + uVar93 * 4) * 0x38;
          uVar98 = (ulong)*(uint *)(lVar99 + unaff_R12 * 4);
          puVar1 = (undefined4 *)
                   (*(long *)(*(long *)&pGVar9[2].numPrimitives + lVar95) + uVar98 * 4);
          uVar101 = puVar1[1];
          uVar49 = puVar1[2];
          pfVar2 = (float *)(*(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar95) +
                            uVar98 * 4);
          fVar177 = *pfVar2;
          fVar183 = pfVar2[1];
          fVar184 = pfVar2[2];
          *(undefined4 *)((long)&local_5e00 + uVar93 * 4) = *puVar1;
          *(undefined4 *)((long)&local_5e00 + uVar93 * 4 + 0x20) = uVar101;
          *(undefined4 *)((long)&local_5e00 + uVar93 * 4 + 0x40) = uVar49;
          local_5f00[uVar93] = fVar177;
          local_5ee0[uVar93] = fVar183;
          local_5ec0[uVar93] = fVar184;
          uVar98 = uVar93 & 0x3f;
          uVar93 = 0;
          uVar94 = uVar94 ^ 1L << uVar98;
          for (uVar98 = uVar94; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
            uVar93 = uVar93 + 1;
          }
        }
        auVar116._8_4_ = 0x3f800000;
        auVar116._0_8_ = 0x3f8000003f800000;
        auVar116._12_4_ = 0x3f800000;
        auVar116._16_4_ = 0x3f800000;
        auVar116._20_4_ = 0x3f800000;
        auVar116._24_4_ = 0x3f800000;
        auVar116._28_4_ = 0x3f800000;
        auVar126 = vsubps_avx(auVar116,auVar132);
        uVar101 = local_5e00._0_4_;
        uVar49 = local_5e00._4_4_;
        uVar62 = local_5e00._8_4_;
        uVar63 = local_5e00._12_4_;
        uVar64 = local_5e00._16_4_;
        uVar65 = local_5e00._20_4_;
        uVar66 = local_5e00._24_4_;
        uVar67 = local_5e00._28_4_;
        uVar68 = local_5e00._64_4_;
        uVar69 = local_5e00._68_4_;
        uVar72 = local_5e00._72_4_;
        uVar75 = local_5e00._76_4_;
        uVar78 = local_5e00._80_4_;
        uVar81 = local_5e00._84_4_;
        uVar84 = local_5e00._88_4_;
        uVar87 = local_5e00._92_4_;
        fVar131 = auVar126._0_4_;
        fVar137 = auVar126._4_4_;
        fVar138 = auVar126._8_4_;
        fVar139 = auVar126._12_4_;
        fVar140 = auVar126._16_4_;
        fVar141 = auVar126._20_4_;
        fVar142 = auVar126._24_4_;
        auVar198._0_4_ = fVar131 * (float)local_5e00._32_4_ + fVar103 * local_5ee0[0];
        auVar198._4_4_ = fVar137 * (float)local_5e00._36_4_ + fVar206 * local_5ee0[1];
        auVar198._8_4_ = fVar138 * (float)local_5e00._40_4_ + fVar208 * local_5ee0[2];
        auVar198._12_4_ = fVar139 * (float)local_5e00._44_4_ + fVar159 * local_5ee0[3];
        auVar198._16_4_ = fVar140 * (float)local_5e00._48_4_ + fVar167 * fStack_5ed0;
        auVar198._20_4_ = fVar141 * (float)local_5e00._52_4_ + fVar168 * fStack_5ecc;
        auVar198._24_4_ = fVar142 * (float)local_5e00._56_4_ + fVar169 * fStack_5ec8;
        auVar198._28_4_ = auVar151._28_4_ + 1.0;
        auVar130 = ZEXT3264(auVar198);
        fVar143 = fVar103 * local_5ec0[0];
        fVar153 = fVar206 * local_5ec0[1];
        fVar154 = fVar208 * local_5ec0[2];
        fVar155 = fVar159 * local_5ec0[3];
        fVar156 = fVar167 * fStack_5eb0;
        fVar157 = fVar168 * fStack_5eac;
        fVar158 = fVar169 * fStack_5ea8;
        uVar94 = local_5f90;
        uVar93 = local_5f98;
        while (fVar210 = fStack_5ee4, fVar209 = fStack_5ee8, fVar207 = fStack_5eec,
              fVar205 = fStack_5ef0, fVar204 = local_5f00[3], fVar202 = local_5f00[2],
              fVar200 = local_5f00[1], fVar197 = local_5f00[0], uVar94 != 0) {
          lVar95 = (long)*(int *)((long)&local_6000.valid + uVar93 * 4) * 0x38;
          uVar98 = (ulong)*(uint *)(lVar99 + 0x10 + unaff_R12 * 4);
          auVar121 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar9[2].numPrimitives + lVar95) + uVar98 * 4);
          auVar182 = ZEXT1664(auVar121);
          auVar104 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar95) + uVar98 * 4);
          *(int *)((long)&local_5e00 + uVar93 * 4) = auVar121._0_4_;
          uVar4 = vextractps_avx(auVar121,1);
          *(undefined4 *)((long)&local_5e00 + uVar93 * 4 + 0x20) = uVar4;
          uVar4 = vextractps_avx(auVar121,2);
          *(undefined4 *)((long)&local_5e00 + uVar93 * 4 + 0x40) = uVar4;
          local_5f00[uVar93] = auVar104._0_4_;
          fVar197 = (float)vextractps_avx(auVar104,1);
          local_5ee0[uVar93] = fVar197;
          fVar197 = (float)vextractps_avx(auVar104,2);
          local_5ec0[uVar93] = fVar197;
          uVar98 = uVar93 & 0x3f;
          uVar93 = 0;
          uVar94 = uVar94 ^ 1L << uVar98;
          for (uVar98 = uVar94; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
            uVar93 = uVar93 + 1;
          }
        }
        auVar117._0_4_ = fVar131 * (float)uVar101 + fVar103 * fVar177;
        auVar117._4_4_ = fVar137 * (float)uVar49 + fVar206 * fVar183;
        auVar117._8_4_ = fVar138 * (float)uVar62 + fVar208 * fVar184;
        auVar117._12_4_ = fVar139 * (float)uVar63 + fVar159 * fVar185;
        auVar117._16_4_ = fVar140 * (float)uVar64 + fVar167 * fVar186;
        auVar117._20_4_ = fVar141 * (float)uVar65 + fVar168 * fVar187;
        auVar117._24_4_ = fVar142 * (float)uVar66 + fVar169 * fVar188;
        auVar117._28_4_ = (float)uVar67 + fVar6;
        uVar101 = local_5e00._0_4_;
        uVar49 = local_5e00._4_4_;
        uVar62 = local_5e00._8_4_;
        uVar63 = local_5e00._12_4_;
        uVar64 = local_5e00._16_4_;
        uVar65 = local_5e00._20_4_;
        uVar66 = local_5e00._24_4_;
        uVar67 = local_5e00._28_4_;
        uVar4 = local_5e00._64_4_;
        uVar70 = local_5e00._68_4_;
        uVar73 = local_5e00._72_4_;
        uVar76 = local_5e00._76_4_;
        uVar79 = local_5e00._80_4_;
        uVar82 = local_5e00._84_4_;
        uVar85 = local_5e00._88_4_;
        uVar88 = local_5e00._92_4_;
        auVar212._0_4_ = fVar103 * local_5ee0[0] + fVar131 * (float)local_5e00._32_4_;
        auVar212._4_4_ = fVar206 * local_5ee0[1] + fVar137 * (float)local_5e00._36_4_;
        auVar212._8_4_ = fVar208 * local_5ee0[2] + fVar138 * (float)local_5e00._40_4_;
        auVar212._12_4_ = fVar159 * local_5ee0[3] + fVar139 * (float)local_5e00._44_4_;
        auVar212._16_4_ = fVar167 * fStack_5ed0 + fVar140 * (float)local_5e00._48_4_;
        auVar212._20_4_ = fVar168 * fStack_5ecc + fVar141 * (float)local_5e00._52_4_;
        auVar212._24_4_ = fVar169 * fStack_5ec8 + fVar142 * (float)local_5e00._56_4_;
        auVar212._28_4_ = auVar195._28_4_ + auVar182._28_4_;
        fVar177 = fVar103 * local_5ec0[0];
        fVar183 = fVar206 * local_5ec0[1];
        fVar184 = fVar208 * local_5ec0[2];
        fVar185 = fVar159 * local_5ec0[3];
        fVar186 = fVar167 * fStack_5eb0;
        fVar187 = fVar168 * fStack_5eac;
        fVar188 = fVar169 * fStack_5ea8;
        auVar195 = ZEXT3264(auVar198);
        uVar94 = local_5f90;
        uVar93 = local_5f98;
        while (fVar61 = fStack_5ee8, fVar60 = fStack_5eec, fVar59 = fStack_5ef0,
              fVar58 = local_5f00[3], fVar57 = local_5f00[2], fVar56 = local_5f00[1],
              fVar6 = local_5f00[0], uVar94 != 0) {
          lVar95 = (long)*(int *)((long)&local_6000.valid + uVar93 * 4) * 0x38;
          uVar98 = (ulong)*(uint *)(lVar99 + 0x20 + unaff_R12 * 4);
          auVar121 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar9[2].numPrimitives + lVar95) + uVar98 * 4);
          auVar104 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar95) + uVar98 * 4);
          auVar130 = ZEXT1664(auVar104);
          *(int *)((long)&local_5e00 + uVar93 * 4) = auVar121._0_4_;
          uVar5 = vextractps_avx(auVar121,1);
          *(undefined4 *)((long)&local_5e00 + uVar93 * 4 + 0x20) = uVar5;
          uVar5 = vextractps_avx(auVar121,2);
          *(undefined4 *)((long)&local_5e00 + uVar93 * 4 + 0x40) = uVar5;
          local_5f00[uVar93] = auVar104._0_4_;
          fVar6 = (float)vextractps_avx(auVar104,1);
          local_5ee0[uVar93] = fVar6;
          fVar6 = (float)vextractps_avx(auVar104,2);
          local_5ec0[uVar93] = fVar6;
          uVar98 = uVar93 & 0x3f;
          uVar93 = 0;
          uVar94 = uVar94 ^ 1L << uVar98;
          for (uVar98 = uVar94; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
            uVar93 = uVar93 + 1;
          }
        }
        local_5fc0._0_4_ = (float)uVar101 * fVar131 + fVar197 * fVar103;
        local_5fc0._4_4_ = (float)uVar49 * fVar137 + fVar200 * fVar206;
        local_5fc0._8_4_ = (float)uVar62 * fVar138 + fVar202 * fVar208;
        local_5fc0._12_4_ = (float)uVar63 * fVar139 + fVar204 * fVar159;
        local_5fc0._16_4_ = (float)uVar64 * fVar140 + fVar205 * fVar167;
        local_5fc0._20_4_ = (float)uVar65 * fVar141 + fVar207 * fVar168;
        local_5fc0._24_4_ = (float)uVar66 * fVar142 + fVar209 * fVar169;
        local_5fc0._28_4_ = (float)uVar67 + fVar210;
        uVar101 = local_5e00._0_4_;
        uVar49 = local_5e00._4_4_;
        uVar62 = local_5e00._8_4_;
        uVar63 = local_5e00._12_4_;
        uVar64 = local_5e00._16_4_;
        uVar65 = local_5e00._20_4_;
        uVar66 = local_5e00._24_4_;
        uVar67 = local_5e00._28_4_;
        uVar5 = local_5e00._64_4_;
        uVar71 = local_5e00._68_4_;
        uVar74 = local_5e00._72_4_;
        uVar77 = local_5e00._76_4_;
        uVar80 = local_5e00._80_4_;
        uVar83 = local_5e00._84_4_;
        uVar86 = local_5e00._88_4_;
        uVar89 = local_5e00._92_4_;
        fVar210 = auVar130._28_4_ + in_ZMM12._28_4_;
        local_5ca0._4_4_ = fVar137 * (float)local_5e00._36_4_ + fVar206 * local_5ee0[1];
        local_5ca0._0_4_ = fVar131 * (float)local_5e00._32_4_ + fVar103 * local_5ee0[0];
        fStack_5c98 = fVar138 * (float)local_5e00._40_4_ + fVar208 * local_5ee0[2];
        fStack_5c94 = fVar139 * (float)local_5e00._44_4_ + fVar159 * local_5ee0[3];
        fStack_5c90 = fVar140 * (float)local_5e00._48_4_ + fVar167 * fStack_5ed0;
        fStack_5c8c = fVar141 * (float)local_5e00._52_4_ + fVar168 * fStack_5ecc;
        fStack_5c88 = fVar142 * (float)local_5e00._56_4_ + fVar169 * fStack_5ec8;
        fStack_5c84 = fVar210;
        fVar197 = fVar103 * local_5ec0[0];
        fVar200 = fVar206 * local_5ec0[1];
        fVar202 = fVar208 * local_5ec0[2];
        fVar204 = fVar159 * local_5ec0[3];
        fVar205 = fVar167 * fStack_5eb0;
        fVar207 = fVar168 * fStack_5eac;
        fVar209 = fVar169 * fStack_5ea8;
        uVar94 = local_5f90;
        uVar93 = local_5f98;
        while (uVar94 != 0) {
          lVar95 = (long)*(int *)((long)&local_6000.valid + uVar93 * 4) * 0x38;
          uVar98 = (ulong)*(uint *)(lVar99 + 0x30 + unaff_R12 * 4);
          auVar121 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar9[2].numPrimitives + lVar95) + uVar98 * 4);
          auVar104 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar95) + uVar98 * 4);
          *(int *)((long)&local_5e00 + uVar93 * 4) = auVar121._0_4_;
          uVar7 = vextractps_avx(auVar121,1);
          *(undefined4 *)((long)&local_5e00 + uVar93 * 4 + 0x20) = uVar7;
          uVar7 = vextractps_avx(auVar121,2);
          *(undefined4 *)((long)&local_5e00 + uVar93 * 4 + 0x40) = uVar7;
          local_5f00[uVar93] = auVar104._0_4_;
          fVar8 = (float)vextractps_avx(auVar104,1);
          local_5ee0[uVar93] = fVar8;
          fVar8 = (float)vextractps_avx(auVar104,2);
          local_5ec0[uVar93] = fVar8;
          uVar98 = uVar93 & 0x3f;
          uVar93 = 0;
          uVar94 = uVar94 ^ 1L << uVar98;
          for (uVar98 = uVar94; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
            uVar93 = uVar93 + 1;
          }
        }
        auVar151 = ZEXT3264(CONCAT428((float)uVar87 + auVar151._28_4_,
                                      CONCAT424(fVar142 * (float)uVar84 + fVar158,
                                                CONCAT420(fVar141 * (float)uVar81 + fVar157,
                                                          CONCAT416(fVar140 * (float)uVar78 +
                                                                    fVar156,CONCAT412(fVar139 * (
                                                  float)uVar75 + fVar155,
                                                  CONCAT48(fVar138 * (float)uVar72 + fVar154,
                                                           CONCAT44(fVar137 * (float)uVar69 +
                                                                    fVar153,fVar131 * (float)uVar68
                                                                            + fVar143))))))));
        local_5a60._0_4_ = fVar131 * (float)uVar4 + fVar177;
        local_5a60._4_4_ = fVar137 * (float)uVar70 + fVar183;
        local_5a60._8_4_ = fVar138 * (float)uVar73 + fVar184;
        local_5a60._12_4_ = fVar139 * (float)uVar76 + fVar185;
        local_5a60._16_4_ = fVar140 * (float)uVar79 + fVar186;
        local_5a60._20_4_ = fVar141 * (float)uVar82 + fVar187;
        local_5a60._24_4_ = fVar142 * (float)uVar85 + fVar188;
        local_5a60._28_4_ = (float)uVar88 + auVar182._28_4_;
        fStack_5b24 = fVar210 + (float)uVar87;
        local_5b40._4_4_ = fVar200 + (float)uVar71 * fVar137;
        local_5b40._0_4_ = fVar197 + (float)uVar5 * fVar131;
        fStack_5b38 = fVar202 + (float)uVar74 * fVar138;
        fStack_5b34 = fVar204 + (float)uVar77 * fVar139;
        fStack_5b30 = fVar205 + (float)uVar80 * fVar140;
        fStack_5b2c = fVar207 + (float)uVar83 * fVar141;
        fStack_5b28 = fVar209 + (float)uVar86 * fVar142;
        fStack_5b44 = (float)uVar88 + fStack_5b24;
        local_5b60._4_4_ = (float)uVar49 * fVar137 + fVar56 * fVar206;
        local_5b60._0_4_ = (float)uVar101 * fVar131 + fVar6 * fVar103;
        fStack_5b58 = (float)uVar62 * fVar138 + fVar57 * fVar208;
        fStack_5b54 = (float)uVar63 * fVar139 + fVar58 * fVar159;
        fStack_5b50 = (float)uVar64 * fVar140 + fVar59 * fVar167;
        fStack_5b4c = (float)uVar65 * fVar141 + fVar60 * fVar168;
        fStack_5b48 = (float)uVar66 * fVar142 + fVar61 * fVar169;
        auVar130 = ZEXT3264(CONCAT428((float)uVar89 + local_5a60._28_4_,
                                      CONCAT424(fVar169 * fStack_5ee8 +
                                                fVar142 * (float)local_5e00._24_4_,
                                                CONCAT420(fVar168 * fStack_5eec +
                                                          fVar141 * (float)local_5e00._20_4_,
                                                          CONCAT416(fVar167 * fStack_5ef0 +
                                                                    fVar140 * (float)local_5e00.
                                                                                     _16_4_,
                                                                    CONCAT412(fVar159 * local_5f00
                                                                                        [3] +
                                                                              fVar139 * (float)
                                                  local_5e00._12_4_,
                                                  CONCAT48(fVar208 * local_5f00[2] +
                                                           fVar138 * (float)local_5e00._8_4_,
                                                           CONCAT44(fVar206 * local_5f00[1] +
                                                                    fVar137 * (float)local_5e00.
                                                                                     _4_4_,
                                                                    fVar103 * local_5f00[0] +
                                                                    fVar131 * (float)local_5e00.
                                                                                     _0_4_))))))));
        auVar165._4_4_ = fVar206 * local_5ee0[1];
        auVar165._0_4_ = fVar103 * local_5ee0[0];
        auVar165._8_4_ = fVar208 * local_5ee0[2];
        auVar165._12_4_ = fVar159 * local_5ee0[3];
        auVar165._16_4_ = fVar167 * fStack_5ed0;
        auVar165._20_4_ = fVar168 * fStack_5ecc;
        auVar165._24_4_ = fVar169 * fStack_5ec8;
        auVar165._28_4_ = fStack_5b44;
        local_5e20._0_4_ = fVar131 * (float)local_5e00._32_4_ + fVar103 * local_5ee0[0];
        local_5e20._4_4_ = fVar137 * (float)local_5e00._36_4_ + fVar206 * local_5ee0[1];
        local_5e20._8_4_ = fVar138 * (float)local_5e00._40_4_ + fVar208 * local_5ee0[2];
        local_5e20._12_4_ = fVar139 * (float)local_5e00._44_4_ + fVar159 * local_5ee0[3];
        local_5e20._16_4_ = fVar140 * (float)local_5e00._48_4_ + fVar167 * fStack_5ed0;
        local_5e20._20_4_ = fVar141 * (float)local_5e00._52_4_ + fVar168 * fStack_5ecc;
        local_5e20._24_4_ = fVar142 * (float)local_5e00._56_4_ + fVar169 * fStack_5ec8;
        local_5e20._28_4_ = (float)uVar67 + fStack_5b44;
        auVar213 = ZEXT3264(CONCAT428(auVar126._28_4_ + auVar132._28_4_,
                                      CONCAT424(fVar142 * (float)local_5e00._88_4_ +
                                                fVar169 * fStack_5ea8,
                                                CONCAT420(fVar141 * (float)local_5e00._84_4_ +
                                                          fVar168 * fStack_5eac,
                                                          CONCAT416(fVar140 * (float)local_5e00.
                                                                                     _80_4_ +
                                                                    fVar167 * fStack_5eb0,
                                                                    CONCAT412(fVar139 * (float)
                                                  local_5e00._76_4_ + fVar159 * local_5ec0[3],
                                                  CONCAT48(fVar138 * (float)local_5e00._72_4_ +
                                                           fVar208 * local_5ec0[2],
                                                           CONCAT44(fVar137 * (float)local_5e00.
                                                                                     _68_4_ +
                                                                    fVar206 * local_5ec0[1],
                                                                    fVar131 * (float)local_5e00.
                                                                                     _64_4_ +
                                                                    fVar103 * local_5ec0[0]))))))));
      }
      local_5f60 = vsubps_avx(auVar117,local_5fc0);
      local_5c60 = auVar212;
      auVar126 = auVar195._0_32_;
      local_5f80 = vsubps_avx(auVar126,auVar212);
      auVar132 = auVar151._0_32_;
      auVar144 = vsubps_avx(auVar132,local_5a60);
      auVar199 = ZEXT3264(auVar144);
      local_5e80 = auVar130._0_32_;
      auVar145 = vsubps_avx(auVar130._0_32_,auVar117);
      auVar193 = vsubps_avx(local_5e20,auVar126);
      local_5a80 = auVar213._0_32_;
      auVar194 = vsubps_avx(auVar213._0_32_,auVar132);
      auVar48._4_4_ = local_5f80._4_4_ * auVar194._4_4_;
      auVar48._0_4_ = local_5f80._0_4_ * auVar194._0_4_;
      auVar48._8_4_ = local_5f80._8_4_ * auVar194._8_4_;
      auVar48._12_4_ = local_5f80._12_4_ * auVar194._12_4_;
      auVar48._16_4_ = local_5f80._16_4_ * auVar194._16_4_;
      auVar48._20_4_ = local_5f80._20_4_ * auVar194._20_4_;
      auVar48._24_4_ = local_5f80._24_4_ * auVar194._24_4_;
      auVar48._28_4_ = auVar165._28_4_;
      auVar17 = vfmsub231ps_fma(auVar48,auVar193,auVar144);
      auVar182._0_4_ = auVar144._0_4_ * auVar145._0_4_;
      auVar182._4_4_ = auVar144._4_4_ * auVar145._4_4_;
      auVar182._8_4_ = auVar144._8_4_ * auVar145._8_4_;
      auVar182._12_4_ = auVar144._12_4_ * auVar145._12_4_;
      auVar182._16_4_ = auVar144._16_4_ * auVar145._16_4_;
      auVar182._20_4_ = auVar144._20_4_ * auVar145._20_4_;
      auVar182._28_36_ = auVar195._28_36_;
      auVar182._24_4_ = auVar144._24_4_ * auVar145._24_4_;
      auVar18 = vfmsub231ps_fma(auVar182._0_32_,auVar194,local_5f60);
      auVar195._0_4_ = auVar193._0_4_ * local_5f60._0_4_;
      auVar195._4_4_ = auVar193._4_4_ * local_5f60._4_4_;
      auVar195._8_4_ = auVar193._8_4_ * local_5f60._8_4_;
      auVar195._12_4_ = auVar193._12_4_ * local_5f60._12_4_;
      auVar195._16_4_ = auVar193._16_4_ * local_5f60._16_4_;
      auVar195._20_4_ = auVar193._20_4_ * local_5f60._20_4_;
      auVar195._28_36_ = auVar130._28_36_;
      auVar195._24_4_ = auVar193._24_4_ * local_5f60._24_4_;
      auVar129 = vsubps_avx(auVar117,*(undefined1 (*) [32])ray);
      auVar182 = ZEXT3264(auVar129);
      auVar13 = vsubps_avx(auVar126,*(undefined1 (*) [32])(ray + 0x20));
      auVar19 = vfmsub231ps_fma(auVar195._0_32_,auVar145,local_5f80);
      auVar105 = vsubps_avx(auVar132,*(undefined1 (*) [32])(ray + 0x40));
      auVar195 = ZEXT3264(auVar105);
      auVar126 = *(undefined1 (*) [32])(ray + 0x80);
      auVar132 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar113 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar152._0_4_ = auVar13._0_4_ * auVar126._0_4_;
      auVar152._4_4_ = auVar13._4_4_ * auVar126._4_4_;
      auVar152._8_4_ = auVar13._8_4_ * auVar126._8_4_;
      auVar152._12_4_ = auVar13._12_4_ * auVar126._12_4_;
      auVar152._16_4_ = auVar13._16_4_ * auVar126._16_4_;
      auVar152._20_4_ = auVar13._20_4_ * auVar126._20_4_;
      auVar152._28_36_ = auVar151._28_36_;
      auVar152._24_4_ = auVar13._24_4_ * auVar126._24_4_;
      auVar14 = vfmsub231ps_fma(auVar152._0_32_,auVar129,auVar132);
      auVar151 = ZEXT1664(auVar14);
      auVar191._0_4_ = auVar19._0_4_ * auVar113._0_4_;
      auVar191._4_4_ = auVar19._4_4_ * auVar113._4_4_;
      auVar191._8_4_ = auVar19._8_4_ * auVar113._8_4_;
      auVar191._12_4_ = auVar19._12_4_ * auVar113._12_4_;
      auVar191._16_4_ = auVar113._16_4_ * 0.0;
      auVar191._20_4_ = auVar113._20_4_ * 0.0;
      auVar191._28_36_ = auVar213._28_36_;
      auVar191._24_4_ = auVar113._24_4_ * 0.0;
      auVar114 = ZEXT1632(auVar18);
      auVar121 = vfmadd231ps_fma(auVar191._0_32_,auVar114,auVar132);
      auVar28._4_4_ = auVar105._4_4_ * auVar132._4_4_;
      auVar28._0_4_ = auVar105._0_4_ * auVar132._0_4_;
      auVar28._8_4_ = auVar105._8_4_ * auVar132._8_4_;
      auVar28._12_4_ = auVar105._12_4_ * auVar132._12_4_;
      auVar28._16_4_ = auVar105._16_4_ * auVar132._16_4_;
      auVar28._20_4_ = auVar105._20_4_ * auVar132._20_4_;
      auVar28._24_4_ = auVar105._24_4_ * auVar132._24_4_;
      auVar28._28_4_ = local_5f80._28_4_;
      auVar15 = vfmsub231ps_fma(auVar28,auVar13,auVar113);
      auVar214 = ZEXT1664(auVar15);
      auVar29._4_4_ = auVar113._4_4_ * auVar129._4_4_;
      auVar29._0_4_ = auVar113._0_4_ * auVar129._0_4_;
      auVar29._8_4_ = auVar113._8_4_ * auVar129._8_4_;
      auVar29._12_4_ = auVar113._12_4_ * auVar129._12_4_;
      auVar29._16_4_ = auVar113._16_4_ * auVar129._16_4_;
      auVar29._20_4_ = auVar113._20_4_ * auVar129._20_4_;
      auVar29._24_4_ = auVar113._24_4_ * auVar129._24_4_;
      auVar29._28_4_ = auVar132._28_4_;
      auVar16 = vfmsub231ps_fma(auVar29,auVar105,auVar126);
      auVar115 = ZEXT1632(auVar17);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar115,auVar126);
      auVar30._4_4_ = auVar194._4_4_ * auVar14._4_4_;
      auVar30._0_4_ = auVar194._0_4_ * auVar14._0_4_;
      auVar30._8_4_ = auVar194._8_4_ * auVar14._8_4_;
      auVar30._12_4_ = auVar194._12_4_ * auVar14._12_4_;
      auVar30._16_4_ = auVar194._16_4_ * 0.0;
      auVar30._20_4_ = auVar194._20_4_ * 0.0;
      auVar30._24_4_ = auVar194._24_4_ * 0.0;
      auVar30._28_4_ = auVar126._28_4_;
      auVar104 = vfmadd231ps_fma(auVar30,ZEXT1632(auVar16),auVar193);
      local_5aa0._8_4_ = 0x80000000;
      local_5aa0._0_8_ = 0x8000000080000000;
      local_5aa0._12_4_ = 0x80000000;
      local_5aa0._16_4_ = 0x80000000;
      local_5aa0._20_4_ = 0x80000000;
      local_5aa0._24_4_ = 0x80000000;
      local_5aa0._28_4_ = 0x80000000;
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT1632(auVar15),auVar145);
      auVar126 = vandps_avx(ZEXT1632(auVar121),local_5aa0);
      in_ZMM12 = ZEXT3264(auVar126);
      uVar196 = auVar126._0_4_;
      auVar211._0_4_ = (float)(uVar196 ^ auVar104._0_4_);
      uVar92 = auVar126._4_4_;
      auVar211._4_4_ = (float)(uVar92 ^ auVar104._4_4_);
      uVar201 = auVar126._8_4_;
      auVar211._8_4_ = (float)(uVar201 ^ auVar104._8_4_);
      uVar203 = auVar126._12_4_;
      auVar211._12_4_ = (float)(uVar203 ^ auVar104._12_4_);
      fVar103 = auVar126._16_4_;
      auVar211._16_4_ = fVar103;
      fVar206 = auVar126._20_4_;
      auVar211._20_4_ = fVar206;
      fVar208 = auVar126._24_4_;
      auVar211._24_4_ = fVar208;
      uVar101 = auVar126._28_4_;
      auVar211._28_4_ = uVar101;
      auVar132 = vcmpps_avx(auVar211,_DAT_01f7b000,5);
      auVar130 = ZEXT3264(auVar122);
      auVar113 = auVar122 & auVar132;
      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar113 >> 0x7f,0) == '\0') &&
            (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar113 >> 0xbf,0) == '\0') &&
          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar113[0x1f]) {
LAB_016a9a5e:
        auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
      }
      else {
        local_5be0 = ZEXT1632(auVar19);
        local_5bc0 = auVar114;
        local_5ba0 = auVar115;
        auVar132 = vandps_avx(auVar132,auVar122);
        auVar108._0_4_ = auVar144._0_4_ * auVar14._0_4_;
        auVar108._4_4_ = auVar144._4_4_ * auVar14._4_4_;
        auVar108._8_4_ = auVar144._8_4_ * auVar14._8_4_;
        auVar108._12_4_ = auVar144._12_4_ * auVar14._12_4_;
        auVar108._16_4_ = auVar144._16_4_ * 0.0;
        auVar108._20_4_ = auVar144._20_4_ * 0.0;
        auVar108._24_4_ = auVar144._24_4_ * 0.0;
        auVar108._28_4_ = 0;
        auVar104 = vfmadd213ps_fma(local_5f80,ZEXT1632(auVar16),auVar108);
        auVar104 = vfmadd213ps_fma(local_5f60,ZEXT1632(auVar15),ZEXT1632(auVar104));
        auVar149._0_4_ = (float)(uVar196 ^ auVar104._0_4_);
        auVar149._4_4_ = (float)(uVar92 ^ auVar104._4_4_);
        auVar149._8_4_ = (float)(uVar201 ^ auVar104._8_4_);
        auVar149._12_4_ = (float)(uVar203 ^ auVar104._12_4_);
        auVar149._16_4_ = fVar103;
        auVar149._20_4_ = fVar206;
        auVar149._24_4_ = fVar208;
        auVar149._28_4_ = uVar101;
        auVar151 = ZEXT3264(auVar149);
        auVar113 = vcmpps_avx(auVar149,_DAT_01f7b000,5);
        auVar145 = auVar132 & auVar113;
        if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar145 >> 0x7f,0) == '\0') &&
              (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar145 >> 0xbf,0) == '\0') &&
            (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar145[0x1f]) goto LAB_016a9a5e;
        auVar145 = vandps_avx(ZEXT1632(auVar121),local_5b80);
        auVar132 = vandps_avx(auVar132,auVar113);
        auVar113 = vsubps_avx(auVar145,auVar211);
        auVar113 = vcmpps_avx(auVar113,auVar149,5);
        auVar193 = auVar132 & auVar113;
        if ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar193 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar193 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar193 >> 0x7f,0) == '\0') &&
              (auVar193 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar193 >> 0xbf,0) == '\0') &&
            (auVar193 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar193[0x1f]) {
          auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
        }
        else {
          local_5f80._0_8_ = lVar99;
          local_5f60._0_8_ = lVar96;
          auVar132 = vandps_avx(auVar113,auVar132);
          auVar41._4_4_ = auVar105._4_4_ * auVar19._4_4_;
          auVar41._0_4_ = auVar105._0_4_ * auVar19._0_4_;
          auVar41._8_4_ = auVar105._8_4_ * auVar19._8_4_;
          auVar41._12_4_ = auVar105._12_4_ * auVar19._12_4_;
          auVar41._16_4_ = auVar105._16_4_ * 0.0;
          auVar41._20_4_ = auVar105._20_4_ * 0.0;
          auVar41._24_4_ = auVar105._24_4_ * 0.0;
          auVar41._28_4_ = local_5fc0._28_4_;
          auVar104 = vfmadd132ps_fma(auVar13,auVar41,auVar114);
          auVar104 = vfmadd132ps_fma(auVar129,ZEXT1632(auVar104),auVar115);
          auVar182 = ZEXT1664(auVar104);
          auVar127._0_4_ = (float)(uVar196 ^ auVar104._0_4_);
          auVar127._4_4_ = (float)(uVar92 ^ auVar104._4_4_);
          auVar127._8_4_ = (float)(uVar201 ^ auVar104._8_4_);
          auVar127._12_4_ = (float)(uVar203 ^ auVar104._12_4_);
          auVar127._16_4_ = fVar103;
          auVar127._20_4_ = fVar206;
          auVar127._24_4_ = fVar208;
          auVar127._28_4_ = uVar101;
          auVar42._4_4_ = auVar145._4_4_ * *(float *)(ray + 100);
          auVar42._0_4_ = auVar145._0_4_ * *(float *)(ray + 0x60);
          auVar42._8_4_ = auVar145._8_4_ * *(float *)(ray + 0x68);
          auVar42._12_4_ = auVar145._12_4_ * *(float *)(ray + 0x6c);
          auVar42._16_4_ = auVar145._16_4_ * *(float *)(ray + 0x70);
          auVar42._20_4_ = auVar145._20_4_ * *(float *)(ray + 0x74);
          auVar42._24_4_ = auVar145._24_4_ * *(float *)(ray + 0x78);
          auVar42._28_4_ = local_5fc0._28_4_;
          auVar43._4_4_ = auVar145._4_4_ * *(float *)(ray + 0x104);
          auVar43._0_4_ = auVar145._0_4_ * *(float *)(ray + 0x100);
          auVar43._8_4_ = auVar145._8_4_ * *(float *)(ray + 0x108);
          auVar43._12_4_ = auVar145._12_4_ * *(float *)(ray + 0x10c);
          auVar43._16_4_ = auVar145._16_4_ * *(float *)(ray + 0x110);
          auVar43._20_4_ = auVar145._20_4_ * *(float *)(ray + 0x114);
          auVar43._24_4_ = auVar145._24_4_ * *(float *)(ray + 0x118);
          auVar43._28_4_ = auVar122._28_4_;
          auVar113 = vcmpps_avx(auVar42,auVar127,1);
          auVar193 = vcmpps_avx(auVar127,auVar43,2);
          auVar113 = vandps_avx(auVar193,auVar113);
          auVar193 = auVar132 & auVar113;
          if ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar193 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar193 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar193 >> 0x7f,0) != '\0') ||
                (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar193 >> 0xbf,0) != '\0') ||
              (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar193[0x1f] < '\0') {
            auVar132 = vandps_avx(auVar113,auVar132);
            auVar113 = vcmpps_avx(ZEXT1632(auVar121),_DAT_01f7b000,4);
            auVar193 = auVar132 & auVar113;
            if ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar193 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar193 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar193 >> 0x7f,0) != '\0') ||
                  (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar193 >> 0xbf,0) != '\0') ||
                (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar193[0x1f] < '\0') {
              auVar132 = vandps_avx(auVar113,auVar132);
              uVar196 = pGVar9->mask;
              auVar111._4_4_ = uVar196;
              auVar111._0_4_ = uVar196;
              auVar111._8_4_ = uVar196;
              auVar111._12_4_ = uVar196;
              auVar111._16_4_ = uVar196;
              auVar111._20_4_ = uVar196;
              auVar111._24_4_ = uVar196;
              auVar111._28_4_ = uVar196;
              auVar113 = vpand_avx2(auVar111,*(undefined1 (*) [32])(ray + 0x120));
              auVar193 = vpcmpeqd_avx2(auVar113,_DAT_01f7b000);
              auVar113 = auVar132 & ~auVar193;
              if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar113 >> 0x7f,0) != '\0') ||
                    (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar113 >> 0xbf,0) != '\0') ||
                  (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar113[0x1f] < '\0') {
                local_5ea0 = vandnps_avx(auVar193,auVar132);
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar113 = vrcpps_avx(auVar145);
                  auVar176._8_4_ = 0x3f800000;
                  auVar176._0_8_ = 0x3f8000003f800000;
                  auVar176._12_4_ = 0x3f800000;
                  auVar176._16_4_ = 0x3f800000;
                  auVar176._20_4_ = 0x3f800000;
                  auVar176._24_4_ = 0x3f800000;
                  auVar176._28_4_ = 0x3f800000;
                  auVar121 = vfnmadd213ps_fma(auVar145,auVar113,auVar176);
                  auVar121 = vfmadd132ps_fma(ZEXT1632(auVar121),auVar113,auVar113);
                  fVar159 = auVar121._0_4_;
                  fVar167 = auVar121._4_4_;
                  fVar168 = auVar121._8_4_;
                  fVar169 = auVar121._12_4_;
                  auVar46._4_4_ = auVar211._4_4_ * fVar167;
                  auVar46._0_4_ = auVar211._0_4_ * fVar159;
                  auVar46._8_4_ = auVar211._8_4_ * fVar168;
                  auVar46._12_4_ = auVar211._12_4_ * fVar169;
                  auVar46._16_4_ = fVar103 * 0.0;
                  auVar46._20_4_ = fVar206 * 0.0;
                  auVar46._24_4_ = fVar208 * 0.0;
                  auVar46._28_4_ = auVar132._28_4_;
                  auVar122 = vminps_avx(auVar46,auVar176);
                  auVar47._4_4_ = fVar167 * auVar149._4_4_;
                  auVar47._0_4_ = fVar159 * auVar149._0_4_;
                  auVar47._8_4_ = fVar168 * auVar149._8_4_;
                  auVar47._12_4_ = fVar169 * auVar149._12_4_;
                  auVar47._16_4_ = fVar103 * 0.0;
                  auVar47._20_4_ = fVar206 * 0.0;
                  auVar47._24_4_ = fVar208 * 0.0;
                  auVar47._28_4_ = uVar101;
                  auVar132 = vminps_avx(auVar47,auVar176);
                  auVar145 = vsubps_avx(auVar176,auVar122);
                  auVar193 = vsubps_avx(auVar176,auVar132);
                  auVar51._8_8_ = uStack_5af8;
                  auVar51._0_8_ = local_5b00;
                  auVar51._16_8_ = uStack_5af0;
                  auVar51._24_8_ = uStack_5ae8;
                  local_5d60 = vblendvps_avx(auVar122,auVar145,auVar51);
                  local_5d80 = vblendvps_avx(auVar132,auVar193,auVar51);
                  local_5e00.field_0.x.field_0 = (vfloat_impl<8>)ZEXT1632(auVar17);
                  local_5e00.field_0.y.field_0 = (vfloat_impl<8>)ZEXT1632(auVar18);
                  local_5e00.field_0.z.field_0 = (vfloat_impl<8>)ZEXT1632(auVar19);
                  local_5da0 = CONCAT44(fVar167 * auVar127._4_4_,fVar159 * auVar127._0_4_);
                  uStack_5d98 = CONCAT44(fVar169 * auVar127._12_4_,fVar168 * auVar127._8_4_);
                  uStack_5d90 = CONCAT44(fVar206 * 0.0,fVar103 * 0.0);
                  uStack_5d88 = CONCAT44(auVar113._28_4_,fVar208 * 0.0);
                  local_6000.geometryUserPtr = local_5c40;
                  local_6000.valid = (int *)local_5f00;
                  local_6000.context = (RTCRayQueryContext *)local_5c20;
                  local_6000.ray = (RTCRayN *)&local_5c00;
                  auVar182 = ZEXT1664(auVar104);
                  auVar195 = ZEXT1664(auVar105._0_16_);
                  auVar199 = ZEXT1664(auVar144._0_16_);
                  in_ZMM12 = ZEXT1664(auVar126._0_16_);
                  auVar214 = ZEXT1664(auVar15);
                  std::
                  _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                  ::
                  _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                            ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                              *)&local_6000,
                             (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                              *)&local_5e00.field_0);
                  pRVar11 = context->user;
                  local_5d40._4_4_ = (undefined4)local_5e30;
                  local_5d40._0_4_ = (undefined4)local_5e30;
                  local_5d40._8_4_ = (undefined4)local_5e30;
                  local_5d40._12_4_ = (undefined4)local_5e30;
                  local_5d40._16_4_ = (undefined4)local_5e30;
                  local_5d40._20_4_ = (undefined4)local_5e30;
                  local_5d40._24_4_ = (undefined4)local_5e30;
                  local_5d40._28_4_ = (undefined4)local_5e30;
                  local_5e00._4_4_ = local_5f00[1];
                  local_5e00._0_4_ = local_5f00[0];
                  local_5e00._12_4_ = local_5f00[3];
                  local_5e00._8_4_ = local_5f00[2];
                  local_5e00._20_4_ = fStack_5eec;
                  local_5e00._16_4_ = fStack_5ef0;
                  local_5e00._28_4_ = fStack_5ee4;
                  local_5e00._24_4_ = fStack_5ee8;
                  local_5e00._36_4_ = local_5ee0[1];
                  local_5e00._32_4_ = local_5ee0[0];
                  local_5e00._44_4_ = local_5ee0[3];
                  local_5e00._40_4_ = local_5ee0[2];
                  local_5e00._52_4_ = fStack_5ecc;
                  local_5e00._48_4_ = fStack_5ed0;
                  local_5e00._60_4_ = uStack_5ec4;
                  local_5e00._56_4_ = fStack_5ec8;
                  auVar121._4_4_ = local_5ec0[1];
                  auVar121._0_4_ = local_5ec0[0];
                  auVar121._8_4_ = local_5ec0[2];
                  auVar121._12_4_ = local_5ec0[3];
                  local_5e00._80_4_ = fStack_5eb0;
                  local_5e00._64_16_ = auVar121;
                  local_5e00._84_4_ = fStack_5eac;
                  local_5e00._88_4_ = fStack_5ea8;
                  local_5e00._92_4_ = uStack_5ea4;
                  auVar151 = ZEXT3264((undefined1  [32])local_5e00.field_0.z.field_0);
                  local_5da0 = local_5c00;
                  uStack_5d98 = uStack_5bf8;
                  uStack_5d90 = uStack_5bf0;
                  uStack_5d88 = uStack_5be8;
                  local_5d60._4_4_ = local_5c80._0_4_;
                  local_5d60._0_4_ = local_5c80._0_4_;
                  local_5d60._8_4_ = local_5c80._0_4_;
                  local_5d60._12_4_ = local_5c80._0_4_;
                  local_5d60._16_4_ = local_5c80._0_4_;
                  local_5d60._20_4_ = local_5c80._0_4_;
                  local_5d60._24_4_ = local_5c80._0_4_;
                  local_5d60._28_4_ = local_5c80._0_4_;
                  auVar126 = vpcmpeqd_avx2(local_5d40,local_5d40);
                  local_5f18[1] = auVar126;
                  *local_5f18 = auVar126;
                  local_5d20 = pRVar11->instID[0];
                  uStack_5d1c = local_5d20;
                  uStack_5d18 = local_5d20;
                  uStack_5d14 = local_5d20;
                  uStack_5d10 = local_5d20;
                  uStack_5d0c = local_5d20;
                  uStack_5d08 = local_5d20;
                  uStack_5d04 = local_5d20;
                  local_5d00 = pRVar11->instPrimID[0];
                  uStack_5cfc = local_5d00;
                  uStack_5cf8 = local_5d00;
                  uStack_5cf4 = local_5d00;
                  uStack_5cf0 = local_5d00;
                  uStack_5cec = local_5d00;
                  uStack_5ce8 = local_5d00;
                  uStack_5ce4 = local_5d00;
                  local_5c80 = *(undefined1 (*) [32])(ray + 0x100);
                  auVar126 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x100),local_5c40,local_5ea0
                                          );
                  *(undefined1 (*) [32])(ray + 0x100) = auVar126;
                  local_5e60 = local_5ea0;
                  local_6000.geometryUserPtr = pGVar9->userPtr;
                  local_6000.valid = (int *)local_5e60;
                  local_6000.context = context->user;
                  local_6000.ray = (RTCRayN *)ray;
                  local_6000.hit = (RTCHitN *)&local_5e00;
                  local_6000.N = 8;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar151 = ZEXT1664(auVar121);
                    auVar182 = ZEXT1664(auVar182._0_16_);
                    auVar195 = ZEXT1664(auVar195._0_16_);
                    auVar199 = ZEXT1664(auVar199._0_16_);
                    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                    auVar214 = ZEXT1664(auVar214._0_16_);
                    (*pGVar9->occlusionFilterN)(&local_6000);
                  }
                  auVar122 = vpcmpeqd_avx2(local_5e60,_DAT_01f7b000);
                  auVar126 = _DAT_01f7b020 & ~auVar122;
                  if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar126 >> 0x7f,0) == '\0') &&
                        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar126 >> 0xbf,0) == '\0') &&
                      (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar126[0x1f]) {
                    local_5ea0._0_8_ = auVar122._0_8_ ^ 0xffffffffffffffff;
                    local_5ea0._8_4_ = auVar122._8_4_ ^ 0xffffffff;
                    local_5ea0._12_4_ = auVar122._12_4_ ^ 0xffffffff;
                    local_5ea0._16_4_ = auVar122._16_4_ ^ 0xffffffff;
                    local_5ea0._20_4_ = auVar122._20_4_ ^ 0xffffffff;
                    local_5ea0._24_4_ = auVar122._24_4_ ^ 0xffffffff;
                    local_5ea0._28_4_ = auVar122._28_4_ ^ 0xffffffff;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar151 = ZEXT1664(auVar151._0_16_);
                      auVar182 = ZEXT1664(auVar182._0_16_);
                      auVar195 = ZEXT1664(auVar195._0_16_);
                      auVar199 = ZEXT1664(auVar199._0_16_);
                      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                      auVar214 = ZEXT1664(auVar214._0_16_);
                      local_5ea0 = local_5e60;
                      (*p_Var12)(&local_6000);
                    }
                    auVar126 = vpcmpeqd_avx2(local_5e60,_DAT_01f7b000);
                    local_5ea0 = auVar126 ^ _DAT_01f7b020;
                    auVar119._8_4_ = 0xff800000;
                    auVar119._0_8_ = 0xff800000ff800000;
                    auVar119._12_4_ = 0xff800000;
                    auVar119._16_4_ = 0xff800000;
                    auVar119._20_4_ = 0xff800000;
                    auVar119._24_4_ = 0xff800000;
                    auVar119._28_4_ = 0xff800000;
                    auVar126 = vblendvps_avx(auVar119,*(undefined1 (*) [32])(local_6000.ray + 0x100)
                                             ,auVar126);
                    *(undefined1 (*) [32])(local_6000.ray + 0x100) = auVar126;
                  }
                  auVar126 = vblendvps_avx(local_5c80,*(undefined1 (*) [32])local_5f88,local_5ea0);
                  *(undefined1 (*) [32])local_5f88 = auVar126;
                }
                auVar126 = vandnps_avx(local_5ea0,local_5f40);
                auVar130 = ZEXT3264(auVar126);
                auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                lVar96 = local_5f60._0_8_;
                lVar99 = local_5f80._0_8_;
                goto LAB_016a9a6d;
              }
            }
          }
          auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar130 = ZEXT3264(auVar122);
        }
      }
LAB_016a9a6d:
      auVar122 = auVar130._0_32_;
      if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0x7f,0) == '\0') &&
            (auVar130 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar122 >> 0xbf,0) == '\0') &&
          (auVar130 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar130[0x1f]) break;
      auVar145 = vsubps_avx(_local_5b60,local_5e80);
      auVar193 = vsubps_avx(_local_5ca0,local_5e20);
      auVar144 = vsubps_avx(_local_5b40,local_5a80);
      auVar151 = ZEXT3264(auVar122);
      auVar194 = vsubps_avx(local_5fc0,_local_5b60);
      auVar129 = vsubps_avx(local_5c60,_local_5ca0);
      auVar13 = vsubps_avx(local_5a60,_local_5b40);
      auVar31._4_4_ = auVar193._4_4_ * auVar13._4_4_;
      auVar31._0_4_ = auVar193._0_4_ * auVar13._0_4_;
      auVar31._8_4_ = auVar193._8_4_ * auVar13._8_4_;
      auVar31._12_4_ = auVar193._12_4_ * auVar13._12_4_;
      auVar31._16_4_ = auVar193._16_4_ * auVar13._16_4_;
      auVar31._20_4_ = auVar193._20_4_ * auVar13._20_4_;
      auVar31._24_4_ = auVar193._24_4_ * auVar13._24_4_;
      auVar31._28_4_ = local_5e80._28_4_;
      auVar17 = vfmsub231ps_fma(auVar31,auVar129,auVar144);
      auVar32._4_4_ = auVar144._4_4_ * auVar194._4_4_;
      auVar32._0_4_ = auVar144._0_4_ * auVar194._0_4_;
      auVar32._8_4_ = auVar144._8_4_ * auVar194._8_4_;
      auVar32._12_4_ = auVar144._12_4_ * auVar194._12_4_;
      auVar32._16_4_ = auVar144._16_4_ * auVar194._16_4_;
      auVar32._20_4_ = auVar144._20_4_ * auVar194._20_4_;
      auVar32._24_4_ = auVar144._24_4_ * auVar194._24_4_;
      auVar32._28_4_ = local_5e20._28_4_;
      auVar18 = vfmsub231ps_fma(auVar32,auVar13,auVar145);
      local_5fc0 = auVar145;
      auVar33._4_4_ = auVar129._4_4_ * auVar145._4_4_;
      auVar33._0_4_ = auVar129._0_4_ * auVar145._0_4_;
      auVar33._8_4_ = auVar129._8_4_ * auVar145._8_4_;
      auVar33._12_4_ = auVar129._12_4_ * auVar145._12_4_;
      auVar33._16_4_ = auVar129._16_4_ * auVar145._16_4_;
      auVar33._20_4_ = auVar129._20_4_ * auVar145._20_4_;
      auVar33._24_4_ = auVar129._24_4_ * auVar145._24_4_;
      auVar33._28_4_ = auVar145._28_4_;
      auVar105 = vsubps_avx(_local_5b60,*(undefined1 (*) [32])ray);
      auVar114 = vsubps_avx(_local_5ca0,*(undefined1 (*) [32])(ray + 0x20));
      auVar115 = vsubps_avx(_local_5b40,*(undefined1 (*) [32])(ray + 0x40));
      local_5e80 = auVar193;
      auVar19 = vfmsub231ps_fma(auVar33,auVar194,auVar193);
      auVar182 = ZEXT1664(auVar19);
      auVar126 = *(undefined1 (*) [32])(ray + 0x80);
      auVar132 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar34._4_4_ = auVar126._4_4_ * auVar114._4_4_;
      auVar34._0_4_ = auVar126._0_4_ * auVar114._0_4_;
      auVar34._8_4_ = auVar126._8_4_ * auVar114._8_4_;
      auVar34._12_4_ = auVar126._12_4_ * auVar114._12_4_;
      auVar34._16_4_ = auVar126._16_4_ * auVar114._16_4_;
      auVar34._20_4_ = auVar126._20_4_ * auVar114._20_4_;
      auVar34._24_4_ = auVar126._24_4_ * auVar114._24_4_;
      auVar34._28_4_ = auVar193._28_4_;
      auVar14 = vfmsub231ps_fma(auVar34,auVar105,auVar132);
      auVar113 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar35._4_4_ = auVar113._4_4_ * auVar19._4_4_;
      auVar35._0_4_ = auVar113._0_4_ * auVar19._0_4_;
      auVar35._8_4_ = auVar113._8_4_ * auVar19._8_4_;
      auVar35._12_4_ = auVar113._12_4_ * auVar19._12_4_;
      auVar35._16_4_ = auVar113._16_4_ * 0.0;
      auVar35._20_4_ = auVar113._20_4_ * 0.0;
      auVar35._24_4_ = auVar113._24_4_ * 0.0;
      auVar35._28_4_ = local_5b40._28_4_;
      auVar121 = vfmadd231ps_fma(auVar35,ZEXT1632(auVar18),auVar132);
      auVar36._4_4_ = auVar132._4_4_ * auVar115._4_4_;
      auVar36._0_4_ = auVar132._0_4_ * auVar115._0_4_;
      auVar36._8_4_ = auVar132._8_4_ * auVar115._8_4_;
      auVar36._12_4_ = auVar132._12_4_ * auVar115._12_4_;
      auVar36._16_4_ = auVar132._16_4_ * auVar115._16_4_;
      auVar36._20_4_ = auVar132._20_4_ * auVar115._20_4_;
      auVar36._24_4_ = auVar132._24_4_ * auVar115._24_4_;
      auVar36._28_4_ = auVar132._28_4_;
      auVar15 = vfmsub231ps_fma(auVar36,auVar114,auVar113);
      auVar37._4_4_ = auVar113._4_4_ * auVar105._4_4_;
      auVar37._0_4_ = auVar113._0_4_ * auVar105._0_4_;
      auVar37._8_4_ = auVar113._8_4_ * auVar105._8_4_;
      auVar37._12_4_ = auVar113._12_4_ * auVar105._12_4_;
      auVar37._16_4_ = auVar113._16_4_ * auVar105._16_4_;
      auVar37._20_4_ = auVar113._20_4_ * auVar105._20_4_;
      auVar37._24_4_ = auVar113._24_4_ * auVar105._24_4_;
      auVar37._28_4_ = auVar113._28_4_;
      auVar16 = vfmsub231ps_fma(auVar37,auVar115,auVar126);
      auVar214 = ZEXT1664(auVar16);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),ZEXT1632(auVar17),auVar126);
      auVar38._4_4_ = auVar13._4_4_ * auVar14._4_4_;
      auVar38._0_4_ = auVar13._0_4_ * auVar14._0_4_;
      auVar38._8_4_ = auVar13._8_4_ * auVar14._8_4_;
      auVar38._12_4_ = auVar13._12_4_ * auVar14._12_4_;
      auVar38._16_4_ = auVar13._16_4_ * 0.0;
      auVar38._20_4_ = auVar13._20_4_ * 0.0;
      auVar38._24_4_ = auVar13._24_4_ * 0.0;
      auVar38._28_4_ = auVar126._28_4_;
      auVar104 = vfmadd231ps_fma(auVar38,ZEXT1632(auVar16),auVar129);
      auVar126 = vandps_avx(ZEXT1632(auVar121),local_5aa0);
      auVar199 = ZEXT3264(auVar126);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT1632(auVar15),auVar194);
      uVar196 = auVar126._0_4_;
      auVar136._0_4_ = (float)(uVar196 ^ auVar104._0_4_);
      uVar92 = auVar126._4_4_;
      auVar136._4_4_ = (float)(uVar92 ^ auVar104._4_4_);
      uVar201 = auVar126._8_4_;
      auVar136._8_4_ = (float)(uVar201 ^ auVar104._8_4_);
      uVar203 = auVar126._12_4_;
      auVar136._12_4_ = (float)(uVar203 ^ auVar104._12_4_);
      fVar103 = auVar126._16_4_;
      auVar136._16_4_ = fVar103;
      fVar206 = auVar126._20_4_;
      auVar136._20_4_ = fVar206;
      fVar208 = auVar126._24_4_;
      auVar136._24_4_ = fVar208;
      uVar101 = auVar126._28_4_;
      auVar136._28_4_ = uVar101;
      auVar132 = vcmpps_avx(auVar136,_DAT_01f7b000,5);
      local_5f40 = auVar122;
      auVar113 = auVar122 & auVar132;
      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar113 >> 0x7f,0) == '\0') &&
            (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar113 >> 0xbf,0) == '\0') &&
          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar113[0x1f]) {
LAB_016a9b93:
        in_ZMM12 = ZEXT3264(auVar132);
        auVar195 = ZEXT3264(auVar144);
        auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
      }
      else {
        local_5e20 = ZEXT1632(auVar19);
        auVar132 = vandps_avx(auVar132,auVar122);
        auVar109._0_4_ = auVar144._0_4_ * auVar14._0_4_;
        auVar109._4_4_ = auVar144._4_4_ * auVar14._4_4_;
        auVar109._8_4_ = auVar144._8_4_ * auVar14._8_4_;
        auVar109._12_4_ = auVar144._12_4_ * auVar14._12_4_;
        auVar109._16_4_ = auVar144._16_4_ * 0.0;
        auVar109._20_4_ = auVar144._20_4_ * 0.0;
        auVar109._24_4_ = auVar144._24_4_ * 0.0;
        auVar109._28_4_ = 0;
        auVar104 = vfmadd213ps_fma(auVar193,ZEXT1632(auVar16),auVar109);
        auVar104 = vfmadd213ps_fma(auVar145,ZEXT1632(auVar15),ZEXT1632(auVar104));
        auVar150._0_4_ = (float)(uVar196 ^ auVar104._0_4_);
        auVar150._4_4_ = (float)(uVar92 ^ auVar104._4_4_);
        auVar150._8_4_ = (float)(uVar201 ^ auVar104._8_4_);
        auVar150._12_4_ = (float)(uVar203 ^ auVar104._12_4_);
        auVar150._16_4_ = fVar103;
        auVar150._20_4_ = fVar206;
        auVar150._24_4_ = fVar208;
        auVar150._28_4_ = uVar101;
        auVar151 = ZEXT3264(auVar150);
        auVar144 = vcmpps_avx(auVar150,_DAT_01f7b000,5);
        auVar122 = auVar132 & auVar144;
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0x7f,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0xbf,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar122[0x1f]) goto LAB_016a9b93;
        auVar122 = vandps_avx(ZEXT1632(auVar121),local_5b80);
        auVar182 = ZEXT3264(auVar122);
        auVar132 = vandps_avx(auVar144,auVar132);
        auVar195 = ZEXT3264(auVar132);
        auVar144 = vsubps_avx(auVar122,auVar136);
        auVar113 = vcmpps_avx(auVar144,auVar150,5);
        in_ZMM12 = ZEXT3264(auVar113);
        auVar145 = auVar132 & auVar113;
        auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar145 >> 0x7f,0) != '\0') ||
              (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar145 >> 0xbf,0) != '\0') ||
            (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar145[0x1f] < '\0') {
          local_5f80._0_8_ = lVar99;
          local_5f60._0_8_ = lVar96;
          auVar132 = vandps_avx(auVar113,auVar132);
          auVar195 = ZEXT3264(auVar132);
          auVar39._4_4_ = auVar115._4_4_ * auVar19._4_4_;
          auVar39._0_4_ = auVar115._0_4_ * auVar19._0_4_;
          auVar39._8_4_ = auVar115._8_4_ * auVar19._8_4_;
          auVar39._12_4_ = auVar115._12_4_ * auVar19._12_4_;
          auVar39._16_4_ = auVar115._16_4_ * 0.0;
          auVar39._20_4_ = auVar115._20_4_ * 0.0;
          auVar39._24_4_ = auVar115._24_4_ * 0.0;
          auVar39._28_4_ = auVar144._28_4_;
          auVar104 = vfmadd213ps_fma(auVar114,ZEXT1632(auVar18),auVar39);
          auVar104 = vfmadd213ps_fma(auVar105,ZEXT1632(auVar17),ZEXT1632(auVar104));
          auVar166._0_4_ = (float)(uVar196 ^ auVar104._0_4_);
          auVar166._4_4_ = (float)(uVar92 ^ auVar104._4_4_);
          auVar166._8_4_ = (float)(uVar201 ^ auVar104._8_4_);
          auVar166._12_4_ = (float)(uVar203 ^ auVar104._12_4_);
          auVar166._16_4_ = fVar103;
          auVar166._20_4_ = fVar206;
          auVar166._24_4_ = fVar208;
          auVar166._28_4_ = uVar101;
          auVar40._4_4_ = auVar122._4_4_ * *(float *)(ray + 100);
          auVar40._0_4_ = auVar122._0_4_ * *(float *)(ray + 0x60);
          auVar40._8_4_ = auVar122._8_4_ * *(float *)(ray + 0x68);
          auVar40._12_4_ = auVar122._12_4_ * *(float *)(ray + 0x6c);
          auVar40._16_4_ = auVar122._16_4_ * *(float *)(ray + 0x70);
          auVar40._20_4_ = auVar122._20_4_ * *(float *)(ray + 0x74);
          auVar40._24_4_ = auVar122._24_4_ * *(float *)(ray + 0x78);
          auVar40._28_4_ = auVar144._28_4_;
          auVar174._0_4_ = auVar122._0_4_ * *(float *)(ray + 0x100);
          auVar174._4_4_ = auVar122._4_4_ * *(float *)(ray + 0x104);
          auVar174._8_4_ = auVar122._8_4_ * *(float *)(ray + 0x108);
          auVar174._12_4_ = auVar122._12_4_ * *(float *)(ray + 0x10c);
          auVar174._16_4_ = auVar122._16_4_ * *(float *)(ray + 0x110);
          auVar174._20_4_ = auVar122._20_4_ * *(float *)(ray + 0x114);
          auVar174._24_4_ = auVar122._24_4_ * *(float *)(ray + 0x118);
          auVar174._28_4_ = 0;
          auVar144 = vcmpps_avx(auVar40,auVar166,1);
          auVar145 = vcmpps_avx(auVar166,auVar174,2);
          auVar144 = vandps_avx(auVar145,auVar144);
          auVar145 = auVar132 & auVar144;
          if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar145 >> 0x7f,0) != '\0') ||
                (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar145 >> 0xbf,0) != '\0') ||
              (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar145[0x1f] < '\0') {
            auVar144 = vandps_avx(auVar132,auVar144);
            auVar145 = vcmpps_avx(ZEXT1632(auVar121),_DAT_01f7b000,4);
            auVar194 = auVar144 & auVar145;
            if ((((((((auVar194 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar194 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar194 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar194 >> 0x7f,0) != '\0') ||
                  (auVar194 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar194 >> 0xbf,0) != '\0') ||
                (auVar194 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar194[0x1f] < '\0') {
              auVar144 = vandps_avx(auVar145,auVar144);
              uVar93 = CONCAT44(0,*(uint *)(lVar99 + 0x40 + unaff_R12 * 4));
              local_5c60._0_8_ = uVar93;
              local_5e80._0_8_ = (context->scene->geometries).items[uVar93].ptr;
              local_5e80._8_24_ = auVar193._8_24_;
              uVar196 = ((Geometry *)local_5e80._0_8_)->mask;
              auVar110._4_4_ = uVar196;
              auVar110._0_4_ = uVar196;
              auVar110._8_4_ = uVar196;
              auVar110._12_4_ = uVar196;
              auVar110._16_4_ = uVar196;
              auVar110._20_4_ = uVar196;
              auVar110._24_4_ = uVar196;
              auVar110._28_4_ = uVar196;
              auVar145 = vpand_avx2(auVar110,*(undefined1 (*) [32])(ray + 0x120));
              auVar193 = vpcmpeqd_avx2(auVar145,_DAT_01f7b000);
              auVar145 = auVar144 & ~auVar193;
              if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar145 >> 0x7f,0) != '\0') ||
                    (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar145 >> 0xbf,0) != '\0') ||
                  (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar145[0x1f] < '\0') {
                local_5ca0._0_4_ = *(undefined4 *)(lVar99 + 0x50 + unaff_R12 * 4);
                local_5fc0 = vandnps_avx(auVar193,auVar144);
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (((Geometry *)local_5e80._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar145 = vrcpps_avx(auVar122);
                  auVar175._8_4_ = 0x3f800000;
                  auVar175._0_8_ = 0x3f8000003f800000;
                  auVar175._12_4_ = 0x3f800000;
                  auVar175._16_4_ = 0x3f800000;
                  auVar175._20_4_ = 0x3f800000;
                  auVar175._24_4_ = 0x3f800000;
                  auVar175._28_4_ = 0x3f800000;
                  auVar121 = vfnmadd213ps_fma(auVar122,auVar145,auVar175);
                  auVar121 = vfmadd132ps_fma(ZEXT1632(auVar121),auVar145,auVar145);
                  fVar159 = auVar121._0_4_;
                  fVar167 = auVar121._4_4_;
                  fVar168 = auVar121._8_4_;
                  fVar169 = auVar121._12_4_;
                  auVar44._4_4_ = fVar167 * auVar136._4_4_;
                  auVar44._0_4_ = fVar159 * auVar136._0_4_;
                  auVar44._8_4_ = fVar168 * auVar136._8_4_;
                  auVar44._12_4_ = fVar169 * auVar136._12_4_;
                  auVar44._16_4_ = fVar103 * 0.0;
                  auVar44._20_4_ = fVar206 * 0.0;
                  auVar44._24_4_ = fVar208 * 0.0;
                  auVar44._28_4_ = uVar101;
                  auVar122 = vminps_avx(auVar44,auVar175);
                  auVar45._4_4_ = fVar167 * auVar150._4_4_;
                  auVar45._0_4_ = fVar159 * auVar150._0_4_;
                  auVar45._8_4_ = fVar168 * auVar150._8_4_;
                  auVar45._12_4_ = fVar169 * auVar150._12_4_;
                  auVar45._16_4_ = fVar103 * 0.0;
                  auVar45._20_4_ = fVar206 * 0.0;
                  auVar45._24_4_ = fVar208 * 0.0;
                  auVar45._28_4_ = uVar101;
                  auVar144 = vminps_avx(auVar45,auVar175);
                  auVar193 = vsubps_avx(auVar175,auVar122);
                  auVar194 = vsubps_avx(auVar175,auVar144);
                  auVar14._8_8_ = uStack_5b18;
                  auVar14._0_8_ = local_5b20;
                  auVar50._16_8_ = uStack_5b10;
                  auVar50._0_16_ = auVar14;
                  auVar50._24_8_ = uStack_5b08;
                  local_5d60 = vblendvps_avx(auVar122,auVar193,auVar50);
                  local_5d80 = vblendvps_avx(auVar144,auVar194,auVar50);
                  local_5e00.field_0.x.field_0 = (vfloat_impl<8>)ZEXT1632(auVar17);
                  local_5e00.field_0.y.field_0 = (vfloat_impl<8>)ZEXT1632(auVar18);
                  local_5e00.field_0.z.field_0 = (vfloat_impl<8>)ZEXT1632(auVar19);
                  local_5da0 = CONCAT44(fVar167 * auVar166._4_4_,fVar159 * auVar166._0_4_);
                  uStack_5d98 = CONCAT44(fVar169 * auVar166._12_4_,fVar168 * auVar166._8_4_);
                  uStack_5d90 = CONCAT44(fVar206 * 0.0,fVar103 * 0.0);
                  uStack_5d88 = CONCAT44(auVar145._28_4_,fVar208 * 0.0);
                  local_6000.geometryUserPtr = local_5c40;
                  local_6000.valid = (int *)local_5f00;
                  local_6000.context = (RTCRayQueryContext *)local_5c20;
                  local_6000.ray = (RTCRayN *)&local_5c00;
                  auVar182 = ZEXT1664(auVar14);
                  auVar195 = ZEXT1664(auVar132._0_16_);
                  auVar199 = ZEXT1664(auVar126._0_16_);
                  in_ZMM12 = ZEXT1664(auVar113._0_16_);
                  auVar214 = ZEXT1664(auVar16);
                  std::
                  _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                  ::
                  _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                            ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                              *)&local_6000,
                             (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                              *)&local_5e00.field_0);
                  pRVar11 = context->user;
                  local_5d40._4_4_ = local_5c60._0_4_;
                  local_5d40._0_4_ = local_5c60._0_4_;
                  local_5d40._8_4_ = local_5c60._0_4_;
                  local_5d40._12_4_ = local_5c60._0_4_;
                  local_5d40._16_4_ = local_5c60._0_4_;
                  local_5d40._20_4_ = local_5c60._0_4_;
                  local_5d40._24_4_ = local_5c60._0_4_;
                  local_5d40._28_4_ = local_5c60._0_4_;
                  local_5e00._4_4_ = local_5f00[1];
                  local_5e00._0_4_ = local_5f00[0];
                  local_5e00._12_4_ = local_5f00[3];
                  local_5e00._8_4_ = local_5f00[2];
                  local_5e00._20_4_ = fStack_5eec;
                  local_5e00._16_4_ = fStack_5ef0;
                  local_5e00._28_4_ = fStack_5ee4;
                  local_5e00._24_4_ = fStack_5ee8;
                  local_5e00._36_4_ = local_5ee0[1];
                  local_5e00._32_4_ = local_5ee0[0];
                  local_5e00._40_4_ = local_5ee0[2];
                  local_5e00._44_4_ = local_5ee0[3];
                  local_5e00._48_4_ = fStack_5ed0;
                  local_5e00._52_4_ = fStack_5ecc;
                  local_5e00._56_4_ = fStack_5ec8;
                  local_5e00._60_4_ = uStack_5ec4;
                  auVar17._4_4_ = local_5ec0[1];
                  auVar17._0_4_ = local_5ec0[0];
                  auVar17._8_4_ = local_5ec0[2];
                  auVar17._12_4_ = local_5ec0[3];
                  local_5e00._80_4_ = fStack_5eb0;
                  local_5e00._64_16_ = auVar17;
                  local_5e00._84_4_ = fStack_5eac;
                  local_5e00._88_4_ = fStack_5ea8;
                  local_5e00._92_4_ = uStack_5ea4;
                  auVar151 = ZEXT3264((undefined1  [32])local_5e00.field_0.z.field_0);
                  local_5da0 = local_5c00;
                  uStack_5d98 = uStack_5bf8;
                  uStack_5d90 = uStack_5bf0;
                  uStack_5d88 = uStack_5be8;
                  local_5d60._4_4_ = local_5ca0._0_4_;
                  local_5d60._0_4_ = local_5ca0._0_4_;
                  local_5d60._8_4_ = local_5ca0._0_4_;
                  local_5d60._12_4_ = local_5ca0._0_4_;
                  local_5d60._16_4_ = local_5ca0._0_4_;
                  local_5d60._20_4_ = local_5ca0._0_4_;
                  local_5d60._24_4_ = local_5ca0._0_4_;
                  local_5d60._28_4_ = local_5ca0._0_4_;
                  auVar126 = vpcmpeqd_avx2(local_5d40,local_5d40);
                  local_5f18[1] = auVar126;
                  *local_5f18 = auVar126;
                  local_5d20 = pRVar11->instID[0];
                  uStack_5d1c = local_5d20;
                  uStack_5d18 = local_5d20;
                  uStack_5d14 = local_5d20;
                  uStack_5d10 = local_5d20;
                  uStack_5d0c = local_5d20;
                  uStack_5d08 = local_5d20;
                  uStack_5d04 = local_5d20;
                  local_5d00 = pRVar11->instPrimID[0];
                  uStack_5cfc = local_5d00;
                  uStack_5cf8 = local_5d00;
                  uStack_5cf4 = local_5d00;
                  uStack_5cf0 = local_5d00;
                  uStack_5cec = local_5d00;
                  uStack_5ce8 = local_5d00;
                  uStack_5ce4 = local_5d00;
                  local_5e20 = *(undefined1 (*) [32])(ray + 0x100);
                  auVar126 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x100),local_5c40,local_5fc0
                                          );
                  *(undefined1 (*) [32])(ray + 0x100) = auVar126;
                  local_5e60 = local_5fc0;
                  local_6000.geometryUserPtr = (void *)*(undefined8 *)(local_5e80._0_8_ + 0x18);
                  local_6000.valid = (int *)local_5e60;
                  local_6000.context = context->user;
                  local_6000.ray = (RTCRayN *)ray;
                  local_6000.hit = (RTCHitN *)&local_5e00;
                  local_6000.N = 8;
                  if (*(code **)(local_5e80._0_8_ + 0x48) != (code *)0x0) {
                    auVar151 = ZEXT1664(auVar17);
                    auVar182 = ZEXT1664(auVar182._0_16_);
                    auVar195 = ZEXT1664(auVar195._0_16_);
                    auVar199 = ZEXT1664(auVar199._0_16_);
                    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                    auVar214 = ZEXT1664(auVar214._0_16_);
                    (**(code **)(local_5e80._0_8_ + 0x48))(&local_6000);
                  }
                  auVar122 = vpcmpeqd_avx2(local_5e60,_DAT_01f7b000);
                  auVar126 = _DAT_01f7b020 & ~auVar122;
                  if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar126 >> 0x7f,0) == '\0') &&
                        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar126 >> 0xbf,0) == '\0') &&
                      (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar126[0x1f]) {
                    local_5fc0._0_8_ = auVar122._0_8_ ^ 0xffffffffffffffff;
                    local_5fc0._8_4_ = auVar122._8_4_ ^ 0xffffffff;
                    local_5fc0._12_4_ = auVar122._12_4_ ^ 0xffffffff;
                    local_5fc0._16_4_ = auVar122._16_4_ ^ 0xffffffff;
                    local_5fc0._20_4_ = auVar122._20_4_ ^ 0xffffffff;
                    local_5fc0._24_4_ = auVar122._24_4_ ^ 0xffffffff;
                    local_5fc0._28_4_ = auVar122._28_4_ ^ 0xffffffff;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_5e80._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar151 = ZEXT1664(auVar151._0_16_);
                      auVar182 = ZEXT1664(auVar182._0_16_);
                      auVar195 = ZEXT1664(auVar195._0_16_);
                      auVar199 = ZEXT1664(auVar199._0_16_);
                      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                      auVar214 = ZEXT1664(auVar214._0_16_);
                      local_5fc0 = local_5e60;
                      (*p_Var12)(&local_6000);
                    }
                    auVar126 = vpcmpeqd_avx2(local_5e60,_DAT_01f7b000);
                    local_5fc0 = auVar126 ^ _DAT_01f7b020;
                    auVar118._8_4_ = 0xff800000;
                    auVar118._0_8_ = 0xff800000ff800000;
                    auVar118._12_4_ = 0xff800000;
                    auVar118._16_4_ = 0xff800000;
                    auVar118._20_4_ = 0xff800000;
                    auVar118._24_4_ = 0xff800000;
                    auVar118._28_4_ = 0xff800000;
                    auVar126 = vblendvps_avx(auVar118,*(undefined1 (*) [32])(local_6000.ray + 0x100)
                                             ,auVar126);
                    *(undefined1 (*) [32])(local_6000.ray + 0x100) = auVar126;
                  }
                  auVar126 = vblendvps_avx(local_5e20,*(undefined1 (*) [32])local_5f88,local_5fc0);
                  *(undefined1 (*) [32])local_5f88 = auVar126;
                }
                auVar122 = vandnps_avx(local_5fc0,local_5f40);
                auVar126 = local_5f40 & ~local_5fc0;
                local_5f40 = auVar122;
                auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                lVar96 = local_5f60._0_8_;
                lVar99 = local_5f80._0_8_;
                if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar126 >> 0x7f,0) != '\0') ||
                      (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar126 >> 0xbf,0) != '\0') ||
                    (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar126[0x1f] < '\0') goto LAB_016a9b9c;
                break;
              }
            }
          }
          auVar213 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
        }
      }
LAB_016a9b9c:
      auVar122 = local_5f40;
    }
    auVar126 = local_5ce0;
    auVar130 = ZEXT3264(local_5ce0);
    auVar132 = vandps_avx(auVar122,local_5ce0);
    lVar95 = local_5e38 + 1;
    auVar122 = local_5ce0 & auVar122;
    local_5ce0 = auVar132;
  } while ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar122 >> 0x7f,0) != '\0') ||
             (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar122 >> 0xbf,0) != '\0') ||
           (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar122[0x1f] < '\0');
  auVar126 = vpcmpeqd_avx2(auVar126,auVar126);
  auVar112._0_4_ = local_5ce0._0_4_ ^ auVar126._0_4_;
  auVar112._4_4_ = local_5ce0._4_4_ ^ auVar126._4_4_;
  auVar112._8_4_ = local_5ce0._8_4_ ^ auVar126._8_4_;
  auVar112._12_4_ = local_5ce0._12_4_ ^ auVar126._12_4_;
  auVar112._16_4_ = local_5ce0._16_4_ ^ auVar126._16_4_;
  auVar112._20_4_ = local_5ce0._20_4_ ^ auVar126._20_4_;
  auVar112._24_4_ = local_5ce0._24_4_ ^ auVar126._24_4_;
  auVar112._28_4_ = local_5ce0._28_4_ ^ auVar126._28_4_;
  auVar52._4_4_ = uStack_5abc;
  auVar52._0_4_ = local_5ac0;
  auVar52._8_4_ = uStack_5ab8;
  auVar52._12_4_ = uStack_5ab4;
  auVar52._16_4_ = uStack_5ab0;
  auVar52._20_4_ = uStack_5aac;
  auVar52._24_4_ = uStack_5aa8;
  auVar52._28_4_ = uStack_5aa4;
  local_5cc0 = vorps_avx(auVar112,auVar52);
  auVar126 = auVar126 & ~local_5cc0;
  if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar126 >> 0x7f,0) == '\0') &&
        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar126 >> 0xbf,0) == '\0') &&
      (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar126[0x1f])
  goto LAB_016aaab4;
  auVar128._8_4_ = 0xff800000;
  auVar128._0_8_ = 0xff800000ff800000;
  auVar128._12_4_ = 0xff800000;
  auVar128._16_4_ = 0xff800000;
  auVar128._20_4_ = 0xff800000;
  auVar128._24_4_ = 0xff800000;
  auVar128._28_4_ = 0xff800000;
  auVar130 = ZEXT3264(auVar128);
  local_5840 = vblendvps_avx(local_5840,auVar128,local_5cc0);
  goto LAB_016a93cb;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }